

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx2::CurveNiMBIntersectorK<4,8>::
     occluded_n<embree::avx2::OrientedCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx2::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  undefined1 (*pauVar3) [12];
  float *pfVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  bool bVar53;
  bool bVar54;
  undefined1 auVar55 [16];
  bool bVar56;
  bool bVar57;
  bool bVar58;
  bool bVar59;
  bool bVar60;
  bool bVar61;
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [12];
  undefined1 auVar70 [12];
  uint uVar71;
  int iVar72;
  uint uVar73;
  uint uVar74;
  uint uVar75;
  ulong uVar76;
  long lVar78;
  byte bVar79;
  uint uVar80;
  ulong uVar81;
  long lVar82;
  bool bVar83;
  bool bVar84;
  float fVar85;
  vint4 bi_2;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined4 uVar86;
  undefined1 auVar99 [16];
  undefined1 auVar103 [32];
  undefined8 extraout_XMM1_Qa;
  vint4 bi_1;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 extraout_var [56];
  float fVar128;
  float fVar147;
  float fVar148;
  vint4 bi;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  float fVar149;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  float fVar150;
  float fVar151;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  float fVar169;
  float fVar190;
  float fVar191;
  vint4 ai_2;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar192;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  float fVar193;
  float fVar210;
  vint4 ai_1;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float fVar211;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  float fVar212;
  undefined8 uVar213;
  float fVar235;
  vint4 ai;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar227 [16];
  float fVar237;
  float fVar238;
  float fVar239;
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  float fVar234;
  float fVar236;
  undefined1 auVar233 [32];
  float fVar240;
  float fVar257;
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [32];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar265 [16];
  undefined1 auVar278 [32];
  float fVar279;
  float fVar289;
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [32];
  float fVar290;
  float fVar299;
  float fVar300;
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  float fVar301;
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  float fVar302;
  float fVar303;
  float fVar304;
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [32];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar333 [16];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  float fVar342;
  float fVar352;
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [32];
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_781;
  undefined1 local_780 [16];
  undefined1 local_770 [8];
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [8];
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  float local_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  float local_6e0;
  float fStack_6dc;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float local_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float local_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float local_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined4 local_510;
  undefined4 local_500;
  float local_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  uint auStack_4e0 [4];
  RTCFilterFunctionNArguments local_4d0;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined1 local_470 [8];
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [32];
  uint uStack_380;
  float afStack_37c [7];
  undefined1 local_360 [32];
  uint local_340;
  uint uStack_33c;
  uint uStack_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  uint uStack_328;
  uint uStack_324;
  uint local_320;
  uint uStack_31c;
  uint uStack_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  uint uStack_308;
  uint uStack_304;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar77;
  undefined1 auVar127 [64];
  undefined1 auVar166 [32];
  
  PVar6 = prim[1];
  uVar76 = (ulong)(byte)PVar6;
  lVar78 = uVar76 * 0x25;
  fVar85 = *(float *)(prim + lVar78 + 0x12);
  auVar14 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar14 = vinsertps_avx(auVar14,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar14 = vsubps_avx(auVar14,*(undefined1 (*) [16])(prim + lVar78 + 6));
  auVar87._0_4_ = fVar85 * auVar14._0_4_;
  auVar87._4_4_ = fVar85 * auVar14._4_4_;
  auVar87._8_4_ = fVar85 * auVar14._8_4_;
  auVar87._12_4_ = fVar85 * auVar14._12_4_;
  auVar112._0_4_ = fVar85 * auVar15._0_4_;
  auVar112._4_4_ = fVar85 * auVar15._4_4_;
  auVar112._8_4_ = fVar85 * auVar15._8_4_;
  auVar112._12_4_ = fVar85 * auVar15._12_4_;
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 4 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 5 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 6 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 0xf + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar174 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar76 + 6)));
  auVar174 = vcvtdq2ps_avx(auVar174);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 0x1a + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 0x1b + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 0x1c + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar343._4_4_ = auVar112._0_4_;
  auVar343._0_4_ = auVar112._0_4_;
  auVar343._8_4_ = auVar112._0_4_;
  auVar343._12_4_ = auVar112._0_4_;
  auVar22 = vshufps_avx(auVar112,auVar112,0x55);
  auVar328 = vshufps_avx(auVar112,auVar112,0xaa);
  fVar85 = auVar328._0_4_;
  auVar181._0_4_ = fVar85 * auVar16._0_4_;
  fVar193 = auVar328._4_4_;
  auVar181._4_4_ = fVar193 * auVar16._4_4_;
  fVar210 = auVar328._8_4_;
  auVar181._8_4_ = fVar210 * auVar16._8_4_;
  fVar151 = auVar328._12_4_;
  auVar181._12_4_ = fVar151 * auVar16._12_4_;
  auVar280._0_4_ = auVar174._0_4_ * fVar85;
  auVar280._4_4_ = auVar174._4_4_ * fVar193;
  auVar280._8_4_ = auVar174._8_4_ * fVar210;
  auVar280._12_4_ = auVar174._12_4_ * fVar151;
  auVar258._0_4_ = auVar21._0_4_ * fVar85;
  auVar258._4_4_ = auVar21._4_4_ * fVar193;
  auVar258._8_4_ = auVar21._8_4_ * fVar210;
  auVar258._12_4_ = auVar21._12_4_ * fVar151;
  auVar328 = vfmadd231ps_fma(auVar181,auVar22,auVar15);
  auVar30 = vfmadd231ps_fma(auVar280,auVar22,auVar18);
  auVar22 = vfmadd231ps_fma(auVar258,auVar20,auVar22);
  auVar89 = vfmadd231ps_fma(auVar328,auVar343,auVar14);
  auVar30 = vfmadd231ps_fma(auVar30,auVar343,auVar17);
  auVar90 = vfmadd231ps_fma(auVar22,auVar19,auVar343);
  auVar344._4_4_ = auVar87._0_4_;
  auVar344._0_4_ = auVar87._0_4_;
  auVar344._8_4_ = auVar87._0_4_;
  auVar344._12_4_ = auVar87._0_4_;
  auVar22 = vshufps_avx(auVar87,auVar87,0x55);
  auVar328 = vshufps_avx(auVar87,auVar87,0xaa);
  fVar85 = auVar328._0_4_;
  auVar129._0_4_ = fVar85 * auVar16._0_4_;
  fVar193 = auVar328._4_4_;
  auVar129._4_4_ = fVar193 * auVar16._4_4_;
  fVar210 = auVar328._8_4_;
  auVar129._8_4_ = fVar210 * auVar16._8_4_;
  fVar151 = auVar328._12_4_;
  auVar129._12_4_ = fVar151 * auVar16._12_4_;
  auVar104._0_4_ = auVar174._0_4_ * fVar85;
  auVar104._4_4_ = auVar174._4_4_ * fVar193;
  auVar104._8_4_ = auVar174._8_4_ * fVar210;
  auVar104._12_4_ = auVar174._12_4_ * fVar151;
  auVar88._0_4_ = auVar21._0_4_ * fVar85;
  auVar88._4_4_ = auVar21._4_4_ * fVar193;
  auVar88._8_4_ = auVar21._8_4_ * fVar210;
  auVar88._12_4_ = auVar21._12_4_ * fVar151;
  auVar15 = vfmadd231ps_fma(auVar129,auVar22,auVar15);
  auVar16 = vfmadd231ps_fma(auVar104,auVar22,auVar18);
  auVar18 = vfmadd231ps_fma(auVar88,auVar22,auVar20);
  auVar104 = vfmadd231ps_fma(auVar15,auVar344,auVar14);
  auVar105 = vfmadd231ps_fma(auVar16,auVar344,auVar17);
  auVar106 = vfmadd231ps_fma(auVar18,auVar344,auVar19);
  auVar345._8_4_ = 0x7fffffff;
  auVar345._0_8_ = 0x7fffffff7fffffff;
  auVar345._12_4_ = 0x7fffffff;
  auVar14 = vandps_avx(auVar89,auVar345);
  auVar214._8_4_ = 0x219392ef;
  auVar214._0_8_ = 0x219392ef219392ef;
  auVar214._12_4_ = 0x219392ef;
  auVar14 = vcmpps_avx(auVar14,auVar214,1);
  auVar15 = vblendvps_avx(auVar89,auVar214,auVar14);
  auVar14 = vandps_avx(auVar30,auVar345);
  auVar14 = vcmpps_avx(auVar14,auVar214,1);
  auVar16 = vblendvps_avx(auVar30,auVar214,auVar14);
  auVar14 = vandps_avx(auVar90,auVar345);
  auVar14 = vcmpps_avx(auVar14,auVar214,1);
  auVar14 = vblendvps_avx(auVar90,auVar214,auVar14);
  auVar17 = vrcpps_avx(auVar15);
  auVar268._8_4_ = 0x3f800000;
  auVar268._0_8_ = &DAT_3f8000003f800000;
  auVar268._12_4_ = 0x3f800000;
  auVar15 = vfnmadd213ps_fma(auVar15,auVar17,auVar268);
  auVar89 = vfmadd132ps_fma(auVar15,auVar17,auVar17);
  auVar15 = vrcpps_avx(auVar16);
  auVar16 = vfnmadd213ps_fma(auVar16,auVar15,auVar268);
  auVar90 = vfmadd132ps_fma(auVar16,auVar15,auVar15);
  auVar15 = vrcpps_avx(auVar14);
  auVar14 = vfnmadd213ps_fma(auVar14,auVar15,auVar268);
  auVar87 = vfmadd132ps_fma(auVar14,auVar15,auVar15);
  fVar85 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar78 + 0x16)) *
           *(float *)(prim + lVar78 + 0x1a);
  auVar139._4_4_ = fVar85;
  auVar139._0_4_ = fVar85;
  auVar139._8_4_ = fVar85;
  auVar139._12_4_ = fVar85;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar76 * 7 + 6);
  auVar14 = vpmovsxwd_avx(auVar14);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar76 * 0xb + 6);
  auVar15 = vpmovsxwd_avx(auVar15);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar17 = vsubps_avx(auVar15,auVar14);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar76 * 9 + 6);
  auVar15 = vpmovsxwd_avx(auVar16);
  auVar88 = vfmadd213ps_fma(auVar17,auVar139,auVar14);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar76 * 0xd + 6);
  auVar16 = vpmovsxwd_avx(auVar17);
  auVar14 = vcvtdq2ps_avx(auVar15);
  auVar15 = vcvtdq2ps_avx(auVar16);
  auVar15 = vsubps_avx(auVar15,auVar14);
  auVar17 = vfmadd213ps_fma(auVar15,auVar139,auVar14);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar76 * 0x12 + 6);
  auVar14 = vpmovsxwd_avx(auVar18);
  auVar14 = vcvtdq2ps_avx(auVar14);
  uVar81 = (ulong)(uint)((int)(uVar76 * 5) << 2);
  auVar174._8_8_ = 0;
  auVar174._0_8_ = *(ulong *)(prim + uVar76 * 2 + uVar81 + 6);
  auVar15 = vpmovsxwd_avx(auVar174);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vsubps_avx(auVar15,auVar14);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar81 + 6);
  auVar15 = vpmovsxwd_avx(auVar19);
  auVar16 = vfmadd213ps_fma(auVar16,auVar139,auVar14);
  auVar14 = vcvtdq2ps_avx(auVar15);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar76 * 0x18 + 6);
  auVar15 = vpmovsxwd_avx(auVar20);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar14);
  auVar18 = vfmadd213ps_fma(auVar15,auVar139,auVar14);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar76 * 0x1d + 6);
  auVar14 = vpmovsxwd_avx(auVar21);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar76 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar15 = vpmovsxwd_avx(auVar22);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar14);
  auVar174 = vfmadd213ps_fma(auVar15,auVar139,auVar14);
  auVar328._8_8_ = 0;
  auVar328._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar76) + 6);
  auVar14 = vpmovsxwd_avx(auVar328);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar76 * 0x23 + 6);
  auVar15 = vpmovsxwd_avx(auVar30);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar14);
  auVar15 = vfmadd213ps_fma(auVar15,auVar139,auVar14);
  auVar14 = vsubps_avx(auVar88,auVar104);
  auVar215._0_4_ = auVar89._0_4_ * auVar14._0_4_;
  auVar215._4_4_ = auVar89._4_4_ * auVar14._4_4_;
  auVar215._8_4_ = auVar89._8_4_ * auVar14._8_4_;
  auVar215._12_4_ = auVar89._12_4_ * auVar14._12_4_;
  auVar14 = vsubps_avx(auVar17,auVar104);
  auVar130._0_4_ = auVar89._0_4_ * auVar14._0_4_;
  auVar130._4_4_ = auVar89._4_4_ * auVar14._4_4_;
  auVar130._8_4_ = auVar89._8_4_ * auVar14._8_4_;
  auVar130._12_4_ = auVar89._12_4_ * auVar14._12_4_;
  auVar14 = vsubps_avx(auVar16,auVar105);
  auVar194._0_4_ = auVar90._0_4_ * auVar14._0_4_;
  auVar194._4_4_ = auVar90._4_4_ * auVar14._4_4_;
  auVar194._8_4_ = auVar90._8_4_ * auVar14._8_4_;
  auVar194._12_4_ = auVar90._12_4_ * auVar14._12_4_;
  auVar14 = vsubps_avx(auVar18,auVar105);
  auVar105._0_4_ = auVar90._0_4_ * auVar14._0_4_;
  auVar105._4_4_ = auVar90._4_4_ * auVar14._4_4_;
  auVar105._8_4_ = auVar90._8_4_ * auVar14._8_4_;
  auVar105._12_4_ = auVar90._12_4_ * auVar14._12_4_;
  auVar14 = vsubps_avx(auVar174,auVar106);
  auVar170._0_4_ = auVar87._0_4_ * auVar14._0_4_;
  auVar170._4_4_ = auVar87._4_4_ * auVar14._4_4_;
  auVar170._8_4_ = auVar87._8_4_ * auVar14._8_4_;
  auVar170._12_4_ = auVar87._12_4_ * auVar14._12_4_;
  auVar14 = vsubps_avx(auVar15,auVar106);
  auVar89._0_4_ = auVar87._0_4_ * auVar14._0_4_;
  auVar89._4_4_ = auVar87._4_4_ * auVar14._4_4_;
  auVar89._8_4_ = auVar87._8_4_ * auVar14._8_4_;
  auVar89._12_4_ = auVar87._12_4_ * auVar14._12_4_;
  auVar14 = vpminsd_avx(auVar215,auVar130);
  auVar15 = vpminsd_avx(auVar194,auVar105);
  auVar14 = vmaxps_avx(auVar14,auVar15);
  auVar15 = vpminsd_avx(auVar170,auVar89);
  uVar86 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar259._4_4_ = uVar86;
  auVar259._0_4_ = uVar86;
  auVar259._8_4_ = uVar86;
  auVar259._12_4_ = uVar86;
  auVar15 = vmaxps_avx(auVar15,auVar259);
  auVar14 = vmaxps_avx(auVar14,auVar15);
  local_430._0_4_ = auVar14._0_4_ * 0.99999964;
  local_430._4_4_ = auVar14._4_4_ * 0.99999964;
  local_430._8_4_ = auVar14._8_4_ * 0.99999964;
  local_430._12_4_ = auVar14._12_4_ * 0.99999964;
  auVar14 = vpmaxsd_avx(auVar215,auVar130);
  auVar15 = vpmaxsd_avx(auVar194,auVar105);
  auVar14 = vminps_avx(auVar14,auVar15);
  auVar15 = vpmaxsd_avx(auVar170,auVar89);
  uVar86 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar131._4_4_ = uVar86;
  auVar131._0_4_ = uVar86;
  auVar131._8_4_ = uVar86;
  auVar131._12_4_ = uVar86;
  auVar15 = vminps_avx(auVar15,auVar131);
  auVar14 = vminps_avx(auVar14,auVar15);
  auVar90._0_4_ = auVar14._0_4_ * 1.0000004;
  auVar90._4_4_ = auVar14._4_4_ * 1.0000004;
  auVar90._8_4_ = auVar14._8_4_ * 1.0000004;
  auVar90._12_4_ = auVar14._12_4_ * 1.0000004;
  auVar106._1_3_ = 0;
  auVar106[0] = PVar6;
  auVar106[4] = PVar6;
  auVar106._5_3_ = 0;
  auVar106[8] = PVar6;
  auVar106._9_3_ = 0;
  auVar106[0xc] = PVar6;
  auVar106._13_3_ = 0;
  auVar15 = vpcmpgtd_avx(auVar106,_DAT_01ff0cf0);
  auVar14 = vcmpps_avx(local_430,auVar90,2);
  auVar14 = vandps_avx(auVar14,auVar15);
  uVar71 = vmovmskps_avx(auVar14);
  local_781 = uVar71 != 0;
  if (uVar71 == 0) {
    return local_781;
  }
  uVar71 = uVar71 & 0xff;
  auVar101._16_16_ = mm_lookupmask_ps._240_16_;
  auVar101._0_16_ = mm_lookupmask_ps._240_16_;
  local_3a0 = vblendps_avx(auVar101,ZEXT832(0) << 0x20,0x80);
  iVar72 = 1 << ((uint)k & 0x1f);
  auVar102._4_4_ = iVar72;
  auVar102._0_4_ = iVar72;
  auVar102._8_4_ = iVar72;
  auVar102._12_4_ = iVar72;
  auVar102._16_4_ = iVar72;
  auVar102._20_4_ = iVar72;
  auVar102._24_4_ = iVar72;
  auVar102._28_4_ = iVar72;
  auVar103 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar101 = vpand_avx2(auVar102,auVar103);
  local_360 = vpcmpeqd_avx2(auVar101,auVar103);
LAB_01793d90:
  lVar78 = 0;
  for (uVar76 = (ulong)uVar71; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000) {
    lVar78 = lVar78 + 1;
  }
  uVar75 = *(uint *)(prim + 2);
  local_340 = *(uint *)(prim + lVar78 * 4 + 6);
  pGVar7 = (context->scene->geometries).items[uVar75].ptr;
  fVar85 = (pGVar7->time_range).lower;
  fVar210 = pGVar7->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar85) / ((pGVar7->time_range).upper - fVar85));
  auVar14 = vroundss_avx(ZEXT416((uint)fVar210),ZEXT416((uint)fVar210),9);
  auVar14 = vminss_avx(auVar14,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
  auVar22 = vmaxss_avx(ZEXT816(0),auVar14);
  uVar76 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           (ulong)local_340 *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var8 = pGVar7[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar82 = (long)(int)auVar22._0_4_ * 0x38;
  lVar9 = *(long *)(_Var8 + lVar82);
  lVar10 = *(long *)(_Var8 + 0x10 + lVar82);
  auVar14 = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar76);
  lVar78 = uVar76 + 1;
  auVar15 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar78);
  lVar1 = uVar76 + 2;
  auVar16 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar1);
  lVar2 = uVar76 + 3;
  pauVar3 = (undefined1 (*) [12])(lVar9 + lVar10 * lVar2);
  auVar69 = *pauVar3;
  fVar85 = *(float *)pauVar3[1];
  lVar9 = *(long *)&pGVar7[4].fnumTimeSegments;
  lVar10 = *(long *)(lVar9 + lVar82);
  lVar11 = *(long *)(lVar9 + 0x10 + lVar82);
  auVar17 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar76);
  auVar18 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar78);
  auVar174 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  pfVar4 = (float *)(lVar10 + lVar11 * lVar2);
  fVar193 = *pfVar4;
  fVar151 = pfVar4[1];
  fVar211 = pfVar4[2];
  fVar150 = pfVar4[3];
  auVar328 = ZEXT816(0) << 0x40;
  auVar305._0_4_ = *(float *)*pauVar3 * 0.0;
  auVar305._4_4_ = *(float *)(*pauVar3 + 4) * 0.0;
  auVar305._8_4_ = *(float *)(*pauVar3 + 8) * 0.0;
  auVar305._12_4_ = fVar85 * 0.0;
  auVar152._8_4_ = 0x3e2aaaab;
  auVar152._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar152._12_4_ = 0x3e2aaaab;
  auVar89 = vfmadd213ps_fma(auVar152,auVar16,auVar305);
  auVar171._8_4_ = 0x3f000000;
  auVar171._0_8_ = 0x3f0000003f000000;
  auVar171._12_4_ = 0x3f000000;
  auVar19 = vfmadd231ps_fma(auVar305,auVar16,auVar171);
  auVar19 = vfnmadd231ps_fma(auVar19,auVar15,auVar328);
  auVar130 = vfnmadd231ps_fma(auVar19,auVar14,auVar171);
  auVar195._0_4_ = fVar193 * 0.0;
  auVar195._4_4_ = fVar151 * 0.0;
  auVar195._8_4_ = fVar211 * 0.0;
  auVar195._12_4_ = fVar150 * 0.0;
  auVar19 = vfmadd213ps_fma(auVar152,auVar174,auVar195);
  auVar153._8_4_ = 0x3f2aaaab;
  auVar153._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar153._12_4_ = 0x3f2aaaab;
  auVar19 = vfmadd231ps_fma(auVar19,auVar18,auVar153);
  auVar19 = vfmadd231ps_fma(auVar19,auVar17,auVar152);
  auVar20 = vfmadd231ps_fma(auVar195,auVar174,auVar171);
  auVar20 = vfnmadd231ps_fma(auVar20,auVar18,auVar328);
  auVar21 = vfnmadd231ps_fma(auVar20,auVar17,auVar171);
  auVar316._0_4_ = *(float *)*pauVar3 * 0.5;
  auVar316._4_4_ = *(float *)(*pauVar3 + 4) * 0.5;
  auVar316._8_4_ = *(float *)(*pauVar3 + 8) * 0.5;
  auVar316._12_4_ = fVar85 * 0.5;
  auVar20 = vfmadd231ps_fma(auVar316,auVar328,auVar16);
  auVar20 = vfnmadd231ps_fma(auVar20,auVar171,auVar15);
  auVar131 = vfnmadd231ps_fma(auVar20,auVar328,auVar14);
  auVar260._0_4_ = fVar193 * 0.16666667;
  auVar260._4_4_ = fVar151 * 0.16666667;
  auVar260._8_4_ = fVar211 * 0.16666667;
  auVar260._12_4_ = fVar150 * 0.16666667;
  auVar20 = vfmadd231ps_fma(auVar260,auVar174,auVar153);
  auVar20 = vfmadd231ps_fma(auVar20,auVar18,auVar152);
  auVar20 = vfmadd231ps_fma(auVar20,auVar17,auVar328);
  auVar216._0_4_ = fVar193 * 0.5;
  auVar216._4_4_ = fVar151 * 0.5;
  auVar216._8_4_ = fVar211 * 0.5;
  auVar216._12_4_ = fVar150 * 0.5;
  auVar174 = vfmadd231ps_fma(auVar216,auVar328,auVar174);
  auVar18 = vfnmadd231ps_fma(auVar174,auVar171,auVar18);
  auVar174 = vfnmadd231ps_fma(auVar18,auVar328,auVar17);
  auVar17 = vshufps_avx(auVar130,auVar130,0xc9);
  auVar18 = vshufps_avx(auVar19,auVar19,0xc9);
  fVar302 = auVar130._0_4_;
  auVar107._0_4_ = fVar302 * auVar18._0_4_;
  fVar237 = auVar130._4_4_;
  auVar107._4_4_ = fVar237 * auVar18._4_4_;
  fVar303 = auVar130._8_4_;
  auVar107._8_4_ = fVar303 * auVar18._8_4_;
  fVar238 = auVar130._12_4_;
  auVar107._12_4_ = fVar238 * auVar18._12_4_;
  auVar87 = vfmsub231ps_fma(auVar107,auVar17,auVar19);
  auVar18 = vshufps_avx(auVar21,auVar21,0xc9);
  auVar108._0_4_ = fVar302 * auVar18._0_4_;
  auVar108._4_4_ = fVar237 * auVar18._4_4_;
  auVar108._8_4_ = fVar303 * auVar18._8_4_;
  auVar108._12_4_ = fVar238 * auVar18._12_4_;
  auVar88 = vfmsub231ps_fma(auVar108,auVar17,auVar21);
  auVar17 = vshufps_avx(auVar131,auVar131,0xc9);
  auVar18 = vshufps_avx(auVar20,auVar20,0xc9);
  fVar304 = auVar131._0_4_;
  auVar109._0_4_ = fVar304 * auVar18._0_4_;
  fVar239 = auVar131._4_4_;
  auVar109._4_4_ = fVar239 * auVar18._4_4_;
  fVar240 = auVar131._8_4_;
  auVar109._8_4_ = fVar240 * auVar18._8_4_;
  fVar257 = auVar131._12_4_;
  auVar109._12_4_ = fVar257 * auVar18._12_4_;
  auVar104 = vfmsub231ps_fma(auVar109,auVar17,auVar20);
  auVar18 = vshufps_avx(auVar174,auVar174,0xc9);
  auVar110._0_4_ = fVar304 * auVar18._0_4_;
  auVar110._4_4_ = fVar239 * auVar18._4_4_;
  auVar110._8_4_ = fVar240 * auVar18._8_4_;
  auVar110._12_4_ = fVar257 * auVar18._12_4_;
  auVar105 = vfmsub231ps_fma(auVar110,auVar17,auVar174);
  lVar10 = *(long *)(_Var8 + 0x38 + lVar82);
  lVar11 = *(long *)(_Var8 + 0x48 + lVar82);
  auVar17 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  pauVar3 = (undefined1 (*) [12])(lVar10 + lVar11 * lVar2);
  auVar70 = *pauVar3;
  fVar150 = *(float *)pauVar3[1];
  lVar12 = *(long *)(lVar9 + 0x38 + lVar82);
  lVar9 = *(long *)(lVar9 + 0x48 + lVar82);
  auVar281._0_4_ = *(float *)*pauVar3 * 0.0;
  auVar281._4_4_ = *(float *)(*pauVar3 + 4) * 0.0;
  auVar281._8_4_ = *(float *)(*pauVar3 + 8) * 0.0;
  auVar281._12_4_ = fVar150 * 0.0;
  auVar90 = vfmadd213ps_fma(auVar152,auVar17,auVar281);
  auVar174 = vfmadd231ps_fma(auVar281,auVar17,auVar171);
  auVar18 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar78);
  auVar19 = vfnmadd231ps_fma(auVar174,auVar18,ZEXT816(0) << 0x20);
  auVar174 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar76);
  auVar170 = vfnmadd231ps_fma(auVar19,auVar174,auVar171);
  auVar19 = *(undefined1 (*) [16])(lVar12 + lVar1 * lVar9);
  pfVar4 = (float *)(lVar12 + lVar9 * lVar2);
  fVar193 = *pfVar4;
  fVar151 = pfVar4[1];
  fVar211 = pfVar4[2];
  fVar128 = pfVar4[3];
  auVar91._0_4_ = fVar193 * 0.0;
  auVar91._4_4_ = fVar151 * 0.0;
  auVar91._8_4_ = fVar211 * 0.0;
  auVar91._12_4_ = fVar128 * 0.0;
  auVar21 = vfmadd213ps_fma(auVar152,auVar19,auVar91);
  auVar20 = *(undefined1 (*) [16])(lVar12 + lVar78 * lVar9);
  auVar111._8_4_ = 0x3f2aaaab;
  auVar111._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar111._12_4_ = 0x3f2aaaab;
  auVar328 = vfmadd231ps_fma(auVar21,auVar20,auVar111);
  auVar21 = *(undefined1 (*) [16])(lVar12 + uVar76 * lVar9);
  auVar30 = vfmadd231ps_fma(auVar328,auVar21,auVar152);
  auVar328 = vshufps_avx(auVar30,auVar30,0xc9);
  fVar300 = auVar170._0_4_;
  auVar196._0_4_ = fVar300 * auVar328._0_4_;
  fVar235 = auVar170._4_4_;
  auVar196._4_4_ = fVar235 * auVar328._4_4_;
  fVar301 = auVar170._8_4_;
  auVar196._8_4_ = fVar301 * auVar328._8_4_;
  fVar236 = auVar170._12_4_;
  auVar196._12_4_ = fVar236 * auVar328._12_4_;
  auVar328 = vshufps_avx(auVar170,auVar170,0xc9);
  auVar106 = vfmsub231ps_fma(auVar196,auVar328,auVar30);
  auVar197._8_4_ = 0x3f000000;
  auVar197._0_8_ = 0x3f0000003f000000;
  auVar197._12_4_ = 0x3f000000;
  auVar30 = vfmadd231ps_fma(auVar91,auVar19,auVar197);
  auVar30 = vfnmadd231ps_fma(auVar30,auVar20,_DAT_01feba10);
  auVar112 = vfnmadd231ps_fma(auVar30,auVar21,auVar197);
  auVar30 = vshufps_avx(auVar112,auVar112,0xc9);
  auVar241._0_4_ = fVar300 * auVar30._0_4_;
  auVar241._4_4_ = fVar235 * auVar30._4_4_;
  auVar241._8_4_ = fVar301 * auVar30._8_4_;
  auVar241._12_4_ = fVar236 * auVar30._12_4_;
  auVar30 = vfmsub231ps_fma(auVar241,auVar328,auVar112);
  auVar92._0_4_ = fVar193 * 0.16666667;
  auVar92._4_4_ = fVar151 * 0.16666667;
  auVar92._8_4_ = fVar211 * 0.16666667;
  auVar92._12_4_ = fVar128 * 0.16666667;
  auVar242._8_4_ = 0x3f2aaaab;
  auVar242._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar242._12_4_ = 0x3f2aaaab;
  auVar328 = vfmadd231ps_fma(auVar92,auVar19,auVar242);
  auVar154._0_4_ = fVar193 * 0.5;
  auVar154._4_4_ = fVar151 * 0.5;
  auVar154._8_4_ = fVar211 * 0.5;
  auVar154._12_4_ = fVar128 * 0.5;
  auVar112 = ZEXT816(0) << 0x20;
  auVar19 = vfmadd231ps_fma(auVar154,auVar112,auVar19);
  auVar328 = vfmadd231ps_fma(auVar328,auVar20,auVar152);
  auVar19 = vfnmadd231ps_fma(auVar19,auVar197,auVar20);
  auVar20 = vfmadd231ps_fma(auVar328,auVar21,auVar112);
  auVar21 = vfnmadd231ps_fma(auVar19,auVar112,auVar21);
  auVar217._0_4_ = *(float *)*pauVar3 * 0.5;
  auVar217._4_4_ = *(float *)(*pauVar3 + 4) * 0.5;
  auVar217._8_4_ = *(float *)(*pauVar3 + 8) * 0.5;
  auVar217._12_4_ = fVar150 * 0.5;
  auVar19 = vfmadd231ps_fma(auVar217,auVar112,auVar17);
  auVar19 = vfnmadd231ps_fma(auVar19,auVar197,auVar18);
  auVar194 = vfnmadd231ps_fma(auVar19,auVar112,auVar174);
  auVar19 = vshufps_avx(auVar20,auVar20,0xc9);
  fVar290 = auVar194._0_4_;
  auVar113._0_4_ = fVar290 * auVar19._0_4_;
  fVar212 = auVar194._4_4_;
  auVar113._4_4_ = fVar212 * auVar19._4_4_;
  fVar299 = auVar194._8_4_;
  auVar113._8_4_ = fVar299 * auVar19._8_4_;
  fVar234 = auVar194._12_4_;
  auVar113._12_4_ = fVar234 * auVar19._12_4_;
  auVar19 = vshufps_avx(auVar194,auVar194,0xc9);
  auVar112 = vfmsub231ps_fma(auVar113,auVar19,auVar20);
  auVar20 = vshufps_avx(auVar21,auVar21,0xc9);
  auVar93._0_4_ = fVar290 * auVar20._0_4_;
  auVar93._4_4_ = fVar212 * auVar20._4_4_;
  auVar93._8_4_ = fVar299 * auVar20._8_4_;
  auVar93._12_4_ = fVar234 * auVar20._12_4_;
  auVar129 = vfmsub231ps_fma(auVar93,auVar19,auVar21);
  fVar210 = fVar210 - auVar22._0_4_;
  local_770._0_4_ = auVar69._0_4_;
  local_770._4_4_ = auVar69._4_4_;
  fStack_768 = auVar69._8_4_;
  auVar114._0_4_ = (float)local_770._0_4_ * 0.16666667;
  auVar114._4_4_ = (float)local_770._4_4_ * 0.16666667;
  auVar114._8_4_ = fStack_768 * 0.16666667;
  auVar114._12_4_ = fVar85 * 0.16666667;
  auVar16 = vfmadd231ps_fma(auVar114,auVar242,auVar16);
  auVar19 = vfmadd231ps_fma(auVar89,auVar15,auVar242);
  auVar15 = vfmadd231ps_fma(auVar16,auVar15,auVar152);
  auVar22 = vfmadd231ps_fma(auVar19,auVar14,auVar152);
  auVar94._0_12_ = ZEXT812(0);
  auVar94._12_4_ = 0;
  auVar328 = vfmadd231ps_fma(auVar15,auVar14,auVar94);
  auVar16 = vpermilps_avx(auVar87,0xc9);
  auVar14 = vdpps_avx(auVar16,auVar16,0x7f);
  fVar193 = auVar14._0_4_;
  auVar172._4_8_ = auVar94._4_8_;
  auVar172._0_4_ = fVar193;
  auVar172._12_4_ = 0;
  auVar15 = vrsqrtss_avx(auVar172,auVar172);
  fVar85 = auVar15._0_4_;
  auVar19 = vpermilps_avx(auVar88,0xc9);
  auVar15 = vdpps_avx(auVar16,auVar19,0x7f);
  fVar85 = fVar193 * -0.5 * fVar85 * fVar85 * fVar85 + fVar85 * 1.5;
  auVar261._0_4_ = fVar193 * auVar19._0_4_;
  auVar261._4_4_ = fVar193 * auVar19._4_4_;
  auVar261._8_4_ = fVar193 * auVar19._8_4_;
  auVar261._12_4_ = fVar193 * auVar19._12_4_;
  fVar193 = auVar15._0_4_;
  auVar198._0_4_ = fVar193 * auVar16._0_4_;
  auVar198._4_4_ = fVar193 * auVar16._4_4_;
  auVar198._8_4_ = fVar193 * auVar16._8_4_;
  auVar198._12_4_ = fVar193 * auVar16._12_4_;
  auVar19 = vsubps_avx(auVar261,auVar198);
  auVar15 = vrcpss_avx(auVar172,auVar172);
  auVar14 = vfnmadd213ss_fma(auVar14,auVar15,SUB6416(ZEXT464(0x40000000),0));
  fVar151 = auVar15._0_4_ * auVar14._0_4_;
  auVar20 = vpermilps_avx(auVar104,0xc9);
  auVar15 = vdpps_avx(auVar20,auVar20,0x7f);
  fVar128 = auVar16._0_4_ * fVar85;
  fVar147 = auVar16._4_4_ * fVar85;
  fVar148 = auVar16._8_4_ * fVar85;
  fVar149 = auVar16._12_4_ * fVar85;
  auVar14 = vblendps_avx(auVar15,_DAT_01feba10,0xe);
  auVar16 = vrsqrtss_avx(auVar14,auVar14);
  fVar211 = auVar15._0_4_;
  fVar193 = auVar16._0_4_;
  fVar193 = fVar193 * 1.5 + fVar211 * -0.5 * fVar193 * fVar193 * fVar193;
  auVar21 = vpermilps_avx(auVar105,0xc9);
  auVar16 = vdpps_avx(auVar20,auVar21,0x7f);
  auVar243._0_4_ = auVar21._0_4_ * fVar211;
  auVar243._4_4_ = auVar21._4_4_ * fVar211;
  auVar243._8_4_ = auVar21._8_4_ * fVar211;
  auVar243._12_4_ = auVar21._12_4_ * fVar211;
  fVar211 = auVar16._0_4_;
  auVar329._0_4_ = fVar211 * auVar20._0_4_;
  auVar329._4_4_ = fVar211 * auVar20._4_4_;
  auVar329._8_4_ = fVar211 * auVar20._8_4_;
  auVar329._12_4_ = fVar211 * auVar20._12_4_;
  auVar16 = vsubps_avx(auVar243,auVar329);
  auVar14 = vrcpss_avx(auVar14,auVar14);
  auVar89 = SUB6416(ZEXT464(0x40000000),0);
  auVar15 = vfnmadd213ss_fma(auVar15,auVar14,auVar89);
  fVar211 = auVar14._0_4_ * auVar15._0_4_;
  fVar169 = auVar20._0_4_ * fVar193;
  fVar190 = auVar20._4_4_ * fVar193;
  fVar191 = auVar20._8_4_ * fVar193;
  fVar192 = auVar20._12_4_ * fVar193;
  auVar14 = vshufps_avx(auVar130,auVar130,0xff);
  auVar15 = vshufps_avx(auVar22,auVar22,0xff);
  auVar262._0_4_ = auVar15._0_4_ * fVar128;
  auVar262._4_4_ = auVar15._4_4_ * fVar147;
  auVar262._8_4_ = auVar15._8_4_ * fVar148;
  auVar262._12_4_ = auVar15._12_4_ * fVar149;
  auVar95._0_4_ = auVar14._0_4_ * fVar128 + auVar15._0_4_ * fVar85 * fVar151 * auVar19._0_4_;
  auVar95._4_4_ = auVar14._4_4_ * fVar147 + auVar15._4_4_ * fVar85 * fVar151 * auVar19._4_4_;
  auVar95._8_4_ = auVar14._8_4_ * fVar148 + auVar15._8_4_ * fVar85 * fVar151 * auVar19._8_4_;
  auVar95._12_4_ = auVar14._12_4_ * fVar149 + auVar15._12_4_ * fVar85 * fVar151 * auVar19._12_4_;
  auVar19 = vsubps_avx(auVar22,auVar262);
  local_6c0._0_4_ = auVar22._0_4_ + auVar262._0_4_;
  local_6c0._4_4_ = auVar22._4_4_ + auVar262._4_4_;
  fStack_6b8 = auVar22._8_4_ + auVar262._8_4_;
  fStack_6b4 = auVar22._12_4_ + auVar262._12_4_;
  auVar20 = vsubps_avx(auVar130,auVar95);
  auVar14 = vshufps_avx(auVar131,auVar131,0xff);
  auVar15 = vshufps_avx(auVar328,auVar328,0xff);
  auVar173._0_4_ = auVar15._0_4_ * fVar169;
  auVar173._4_4_ = auVar15._4_4_ * fVar190;
  auVar173._8_4_ = auVar15._8_4_ * fVar191;
  auVar173._12_4_ = auVar15._12_4_ * fVar192;
  auVar155._0_4_ = auVar14._0_4_ * fVar169 + auVar15._0_4_ * fVar193 * auVar16._0_4_ * fVar211;
  auVar155._4_4_ = auVar14._4_4_ * fVar190 + auVar15._4_4_ * fVar193 * auVar16._4_4_ * fVar211;
  auVar155._8_4_ = auVar14._8_4_ * fVar191 + auVar15._8_4_ * fVar193 * auVar16._8_4_ * fVar211;
  auVar155._12_4_ = auVar14._12_4_ * fVar192 + auVar15._12_4_ * fVar193 * auVar16._12_4_ * fVar211;
  auVar16 = vsubps_avx(auVar328,auVar173);
  local_770._4_4_ = auVar328._4_4_ + auVar173._4_4_;
  local_770._0_4_ = auVar328._0_4_ + auVar173._0_4_;
  fStack_768 = auVar328._8_4_ + auVar173._8_4_;
  fStack_764 = auVar328._12_4_ + auVar173._12_4_;
  auVar21 = vsubps_avx(auVar131,auVar155);
  auVar96._8_4_ = 0x3e2aaaab;
  auVar96._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar96._12_4_ = 0x3e2aaaab;
  local_5b0 = auVar70._0_4_;
  fStack_5ac = auVar70._4_4_;
  fStack_5a8 = auVar70._8_4_;
  auVar330._0_4_ = local_5b0 * 0.16666667;
  auVar330._4_4_ = fStack_5ac * 0.16666667;
  auVar330._8_4_ = fStack_5a8 * 0.16666667;
  auVar330._12_4_ = fVar150 * 0.16666667;
  auVar132._8_4_ = 0x3f2aaaab;
  auVar132._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar132._12_4_ = 0x3f2aaaab;
  auVar14 = vfmadd231ps_fma(auVar330,auVar132,auVar17);
  auVar15 = vfmadd231ps_fma(auVar90,auVar18,auVar132);
  auVar14 = vfmadd231ps_fma(auVar14,auVar18,auVar96);
  auVar22 = vfmadd231ps_fma(auVar15,auVar174,auVar96);
  auVar328 = vfmadd231ps_fma(auVar14,auVar174,ZEXT816(0) << 0x20);
  auVar18 = vpermilps_avx(auVar106,0xc9);
  auVar14 = vdpps_avx(auVar18,auVar18,0x7f);
  fVar193 = auVar14._0_4_;
  auVar174 = ZEXT416((uint)fVar193);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = SUB648(ZEXT6064((undefined1  [60])0x0),4);
  auVar15 = vrsqrtss_avx(auVar174,auVar174);
  fVar85 = auVar15._0_4_;
  auVar17 = vpermilps_avx(auVar30,0xc9);
  auVar15 = vdpps_avx(auVar18,auVar17,0x7f);
  fVar85 = fVar85 * 1.5 + fVar85 * fVar85 * fVar193 * -0.5 * fVar85;
  auVar244._0_4_ = auVar17._0_4_ * fVar193;
  auVar244._4_4_ = auVar17._4_4_ * fVar193;
  auVar244._8_4_ = auVar17._8_4_ * fVar193;
  auVar244._12_4_ = auVar17._12_4_ * fVar193;
  fVar193 = auVar15._0_4_;
  auVar263._0_4_ = fVar193 * auVar18._0_4_;
  auVar263._4_4_ = fVar193 * auVar18._4_4_;
  auVar263._8_4_ = fVar193 * auVar18._8_4_;
  auVar263._12_4_ = fVar193 * auVar18._12_4_;
  auVar17 = vsubps_avx(auVar244,auVar263);
  auVar15 = vrcpss_avx(auVar174,auVar174);
  auVar14 = vfnmadd213ss_fma(auVar14,auVar15,auVar89);
  fVar151 = auVar15._0_4_ * auVar14._0_4_;
  auVar174 = vpermilps_avx(auVar112,0xc9);
  auVar14 = vdpps_avx(auVar174,auVar174,0x7f);
  fVar150 = auVar18._0_4_ * fVar85;
  fVar128 = auVar18._4_4_ * fVar85;
  fVar147 = auVar18._8_4_ * fVar85;
  fVar148 = auVar18._12_4_ * fVar85;
  fVar211 = auVar14._0_4_;
  auVar175._4_12_ = SUB1612(auVar23 << 0x40,4);
  auVar175._0_4_ = fVar211;
  auVar15 = vrsqrtss_avx(auVar175,auVar175);
  fVar193 = auVar15._0_4_;
  fVar193 = fVar211 * -0.5 * fVar193 * fVar193 * fVar193 + fVar193 * 1.5;
  auVar18 = vpermilps_avx(auVar129,0xc9);
  auVar15 = vdpps_avx(auVar174,auVar18,0x7f);
  auVar306._0_4_ = fVar211 * auVar18._0_4_;
  auVar306._4_4_ = fVar211 * auVar18._4_4_;
  auVar306._8_4_ = fVar211 * auVar18._8_4_;
  auVar306._12_4_ = fVar211 * auVar18._12_4_;
  fVar211 = auVar15._0_4_;
  auVar346._0_4_ = fVar211 * auVar174._0_4_;
  auVar346._4_4_ = fVar211 * auVar174._4_4_;
  auVar346._8_4_ = fVar211 * auVar174._8_4_;
  auVar346._12_4_ = fVar211 * auVar174._12_4_;
  auVar18 = vsubps_avx(auVar306,auVar346);
  auVar15 = vrcpss_avx(auVar175,auVar175);
  auVar14 = vfnmadd213ss_fma(auVar14,auVar15,auVar89);
  fVar211 = auVar14._0_4_ * auVar15._0_4_;
  fVar149 = auVar174._0_4_ * fVar193;
  fVar169 = auVar174._4_4_ * fVar193;
  fVar190 = auVar174._8_4_ * fVar193;
  fVar191 = auVar174._12_4_ * fVar193;
  auVar14 = vshufps_avx(auVar170,auVar170,0xff);
  auVar15 = vshufps_avx(auVar22,auVar22,0xff);
  auVar156._0_4_ = auVar15._0_4_ * fVar150;
  auVar156._4_4_ = auVar15._4_4_ * fVar128;
  auVar156._8_4_ = auVar15._8_4_ * fVar147;
  auVar156._12_4_ = auVar15._12_4_ * fVar148;
  auVar115._0_4_ = auVar14._0_4_ * fVar150 + auVar15._0_4_ * fVar85 * fVar151 * auVar17._0_4_;
  auVar115._4_4_ = auVar14._4_4_ * fVar128 + auVar15._4_4_ * fVar85 * fVar151 * auVar17._4_4_;
  auVar115._8_4_ = auVar14._8_4_ * fVar147 + auVar15._8_4_ * fVar85 * fVar151 * auVar17._8_4_;
  auVar115._12_4_ = auVar14._12_4_ * fVar148 + auVar15._12_4_ * fVar85 * fVar151 * auVar17._12_4_;
  auVar17 = vsubps_avx(auVar22,auVar156);
  fVar151 = auVar22._0_4_ + auVar156._0_4_;
  fVar150 = auVar22._4_4_ + auVar156._4_4_;
  fVar128 = auVar22._8_4_ + auVar156._8_4_;
  fVar147 = auVar22._12_4_ + auVar156._12_4_;
  auVar174 = vsubps_avx(auVar170,auVar115);
  auVar14 = vshufps_avx(auVar194,auVar194,0xff);
  auVar15 = vshufps_avx(auVar328,auVar328,0xff);
  auVar282._0_4_ = auVar15._0_4_ * fVar149;
  auVar282._4_4_ = auVar15._4_4_ * fVar169;
  auVar282._8_4_ = auVar15._8_4_ * fVar190;
  auVar282._12_4_ = auVar15._12_4_ * fVar191;
  auVar116._0_4_ = auVar14._0_4_ * fVar149 + auVar15._0_4_ * fVar193 * auVar18._0_4_ * fVar211;
  auVar116._4_4_ = auVar14._4_4_ * fVar169 + auVar15._4_4_ * fVar193 * auVar18._4_4_ * fVar211;
  auVar116._8_4_ = auVar14._8_4_ * fVar190 + auVar15._8_4_ * fVar193 * auVar18._8_4_ * fVar211;
  auVar116._12_4_ = auVar14._12_4_ * fVar191 + auVar15._12_4_ * fVar193 * auVar18._12_4_ * fVar211;
  auVar14 = vsubps_avx(auVar328,auVar282);
  auVar176._0_4_ = auVar328._0_4_ + auVar282._0_4_;
  auVar176._4_4_ = auVar328._4_4_ + auVar282._4_4_;
  auVar176._8_4_ = auVar328._8_4_ + auVar282._8_4_;
  auVar176._12_4_ = auVar328._12_4_ + auVar282._12_4_;
  auVar15 = vsubps_avx(auVar194,auVar116);
  local_760._0_4_ = auVar20._0_4_;
  local_760._4_4_ = auVar20._4_4_;
  fStack_758 = auVar20._8_4_;
  fStack_754 = auVar20._12_4_;
  auVar218._0_4_ = auVar19._0_4_ + (float)local_760._0_4_ * 0.33333334;
  auVar218._4_4_ = auVar19._4_4_ + (float)local_760._4_4_ * 0.33333334;
  auVar218._8_4_ = auVar19._8_4_ + fStack_758 * 0.33333334;
  auVar218._12_4_ = auVar19._12_4_ + fStack_754 * 0.33333334;
  fVar85 = 1.0 - fVar210;
  auVar117._4_4_ = fVar85;
  auVar117._0_4_ = fVar85;
  auVar117._8_4_ = fVar85;
  auVar117._12_4_ = fVar85;
  auVar307._0_4_ = fVar210 * auVar17._0_4_;
  auVar307._4_4_ = fVar210 * auVar17._4_4_;
  auVar307._8_4_ = fVar210 * auVar17._8_4_;
  auVar307._12_4_ = fVar210 * auVar17._12_4_;
  auVar22 = vfmadd231ps_fma(auVar307,auVar117,auVar19);
  auVar133._0_4_ = fVar210 * (auVar17._0_4_ + auVar174._0_4_ * 0.33333334);
  auVar133._4_4_ = fVar210 * (auVar17._4_4_ + auVar174._4_4_ * 0.33333334);
  auVar133._8_4_ = fVar210 * (auVar17._8_4_ + auVar174._8_4_ * 0.33333334);
  auVar133._12_4_ = fVar210 * (auVar17._12_4_ + auVar174._12_4_ * 0.33333334);
  auVar328 = vfmadd231ps_fma(auVar133,auVar117,auVar218);
  local_710 = auVar21._0_4_;
  fStack_70c = auVar21._4_4_;
  fStack_708 = auVar21._8_4_;
  fStack_704 = auVar21._12_4_;
  auVar134._0_4_ = local_710 * 0.33333334;
  auVar134._4_4_ = fStack_70c * 0.33333334;
  auVar134._8_4_ = fStack_708 * 0.33333334;
  auVar134._12_4_ = fStack_704 * 0.33333334;
  auVar17 = vsubps_avx(auVar16,auVar134);
  auVar331._0_4_ = (float)local_6c0._0_4_ + (fVar302 + auVar95._0_4_) * 0.33333334;
  auVar331._4_4_ = (float)local_6c0._4_4_ + (fVar237 + auVar95._4_4_) * 0.33333334;
  auVar331._8_4_ = fStack_6b8 + (fVar303 + auVar95._8_4_) * 0.33333334;
  auVar331._12_4_ = fStack_6b4 + (fVar238 + auVar95._12_4_) * 0.33333334;
  auVar291._0_4_ = (fVar304 + auVar155._0_4_) * 0.33333334;
  auVar291._4_4_ = (fVar239 + auVar155._4_4_) * 0.33333334;
  auVar291._8_4_ = (fVar240 + auVar155._8_4_) * 0.33333334;
  auVar291._12_4_ = (fVar257 + auVar155._12_4_) * 0.33333334;
  auVar18 = vsubps_avx(_local_770,auVar291);
  auVar308._0_4_ = auVar15._0_4_ * 0.33333334;
  auVar308._4_4_ = auVar15._4_4_ * 0.33333334;
  auVar308._8_4_ = auVar15._8_4_ * 0.33333334;
  auVar308._12_4_ = auVar15._12_4_ * 0.33333334;
  auVar15 = vsubps_avx(auVar14,auVar308);
  auVar264._0_4_ = (fVar290 + auVar116._0_4_) * 0.33333334;
  auVar264._4_4_ = (fVar212 + auVar116._4_4_) * 0.33333334;
  auVar264._8_4_ = (fVar299 + auVar116._8_4_) * 0.33333334;
  auVar264._12_4_ = (fVar234 + auVar116._12_4_) * 0.33333334;
  auVar174 = vsubps_avx(auVar176,auVar264);
  auVar309._0_4_ = fVar210 * auVar15._0_4_;
  auVar309._4_4_ = fVar210 * auVar15._4_4_;
  auVar309._8_4_ = fVar210 * auVar15._8_4_;
  auVar309._12_4_ = fVar210 * auVar15._12_4_;
  auVar245._0_4_ = fVar210 * auVar14._0_4_;
  auVar245._4_4_ = fVar210 * auVar14._4_4_;
  auVar245._8_4_ = fVar210 * auVar14._8_4_;
  auVar245._12_4_ = fVar210 * auVar14._12_4_;
  auVar30 = vfmadd231ps_fma(auVar309,auVar117,auVar17);
  auVar89 = vfmadd231ps_fma(auVar245,auVar117,auVar16);
  auVar135._0_4_ = fVar210 * fVar151;
  auVar135._4_4_ = fVar210 * fVar150;
  auVar135._8_4_ = fVar210 * fVar128;
  auVar135._12_4_ = fVar210 * fVar147;
  auVar157._0_4_ = fVar210 * (fVar151 + (fVar300 + auVar115._0_4_) * 0.33333334);
  auVar157._4_4_ = fVar210 * (fVar150 + (fVar235 + auVar115._4_4_) * 0.33333334);
  auVar157._8_4_ = fVar210 * (fVar128 + (fVar301 + auVar115._8_4_) * 0.33333334);
  auVar157._12_4_ = fVar210 * (fVar147 + (fVar236 + auVar115._12_4_) * 0.33333334);
  auVar199._0_4_ = fVar210 * auVar174._0_4_;
  auVar199._4_4_ = fVar210 * auVar174._4_4_;
  auVar199._8_4_ = fVar210 * auVar174._8_4_;
  auVar199._12_4_ = fVar210 * auVar174._12_4_;
  auVar177._0_4_ = fVar210 * auVar176._0_4_;
  auVar177._4_4_ = fVar210 * auVar176._4_4_;
  auVar177._8_4_ = fVar210 * auVar176._8_4_;
  auVar177._12_4_ = fVar210 * auVar176._12_4_;
  auVar90 = vfmadd231ps_fma(auVar135,auVar117,_local_6c0);
  auVar87 = vfmadd231ps_fma(auVar157,auVar117,auVar331);
  auVar88 = vfmadd231ps_fma(auVar199,auVar117,auVar18);
  auVar14 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar14 = vinsertps_avx(auVar14,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  auVar104 = vfmadd231ps_fma(auVar177,auVar117,_local_770);
  auVar20 = vsubps_avx(auVar22,auVar14);
  auVar15 = vshufps_avx(auVar20,auVar20,0x55);
  auVar16 = vshufps_avx(auVar20,auVar20,0xaa);
  aVar5 = pre->ray_space[k].vy.field_0;
  fVar85 = pre->ray_space[k].vz.field_0.m128[0];
  fVar193 = pre->ray_space[k].vz.field_0.m128[1];
  fVar210 = pre->ray_space[k].vz.field_0.m128[2];
  fVar151 = pre->ray_space[k].vz.field_0.m128[3];
  auVar97._0_4_ = fVar85 * auVar16._0_4_;
  auVar97._4_4_ = fVar193 * auVar16._4_4_;
  auVar97._8_4_ = fVar210 * auVar16._8_4_;
  auVar97._12_4_ = fVar151 * auVar16._12_4_;
  auVar17 = vfmadd231ps_fma(auVar97,(undefined1  [16])aVar5,auVar15);
  auVar21 = vsubps_avx(auVar328,auVar14);
  auVar15 = vshufps_avx(auVar21,auVar21,0x55);
  auVar16 = vshufps_avx(auVar21,auVar21,0xaa);
  auVar353._0_4_ = fVar85 * auVar16._0_4_;
  auVar353._4_4_ = fVar193 * auVar16._4_4_;
  auVar353._8_4_ = fVar210 * auVar16._8_4_;
  auVar353._12_4_ = fVar151 * auVar16._12_4_;
  auVar16 = vfmadd231ps_fma(auVar353,(undefined1  [16])aVar5,auVar15);
  local_3c0 = vsubps_avx(auVar30,auVar14);
  auVar15 = vshufps_avx(local_3c0,local_3c0,0xaa);
  auVar347._0_4_ = fVar85 * auVar15._0_4_;
  auVar347._4_4_ = fVar193 * auVar15._4_4_;
  auVar347._8_4_ = fVar210 * auVar15._8_4_;
  auVar347._12_4_ = fVar151 * auVar15._12_4_;
  auVar15 = vshufps_avx(local_3c0,local_3c0,0x55);
  auVar18 = vfmadd231ps_fma(auVar347,(undefined1  [16])aVar5,auVar15);
  local_3d0 = vsubps_avx(auVar89,auVar14);
  auVar15 = vshufps_avx(local_3d0,local_3d0,0xaa);
  auVar332._0_4_ = fVar85 * auVar15._0_4_;
  auVar332._4_4_ = fVar193 * auVar15._4_4_;
  auVar332._8_4_ = fVar210 * auVar15._8_4_;
  auVar332._12_4_ = fVar151 * auVar15._12_4_;
  auVar15 = vshufps_avx(local_3d0,local_3d0,0x55);
  auVar174 = vfmadd231ps_fma(auVar332,(undefined1  [16])aVar5,auVar15);
  local_3e0 = vsubps_avx(auVar90,auVar14);
  auVar15 = vshufps_avx(local_3e0,local_3e0,0xaa);
  auVar178._0_4_ = fVar85 * auVar15._0_4_;
  auVar178._4_4_ = fVar193 * auVar15._4_4_;
  auVar178._8_4_ = fVar210 * auVar15._8_4_;
  auVar178._12_4_ = fVar151 * auVar15._12_4_;
  auVar15 = vshufps_avx(local_3e0,local_3e0,0x55);
  auVar19 = vfmadd231ps_fma(auVar178,(undefined1  [16])aVar5,auVar15);
  local_3f0 = vsubps_avx(auVar87,auVar14);
  auVar15 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar246._0_4_ = fVar85 * auVar15._0_4_;
  auVar246._4_4_ = fVar193 * auVar15._4_4_;
  auVar246._8_4_ = fVar210 * auVar15._8_4_;
  auVar246._12_4_ = fVar151 * auVar15._12_4_;
  auVar15 = vshufps_avx(local_3f0,local_3f0,0x55);
  auVar105 = vfmadd231ps_fma(auVar246,(undefined1  [16])aVar5,auVar15);
  local_400 = vsubps_avx(auVar88,auVar14);
  auVar15 = vshufps_avx(local_400,local_400,0xaa);
  auVar283._0_4_ = fVar85 * auVar15._0_4_;
  auVar283._4_4_ = fVar193 * auVar15._4_4_;
  auVar283._8_4_ = fVar210 * auVar15._8_4_;
  auVar283._12_4_ = fVar151 * auVar15._12_4_;
  auVar15 = vshufps_avx(local_400,local_400,0x55);
  auVar15 = vfmadd231ps_fma(auVar283,(undefined1  [16])aVar5,auVar15);
  local_410 = vsubps_avx(auVar104,auVar14);
  auVar14 = vshufps_avx(local_410,local_410,0xaa);
  auVar200._0_4_ = fVar85 * auVar14._0_4_;
  auVar200._4_4_ = fVar193 * auVar14._4_4_;
  auVar200._8_4_ = fVar210 * auVar14._8_4_;
  auVar200._12_4_ = fVar151 * auVar14._12_4_;
  auVar14 = vshufps_avx(local_410,local_410,0x55);
  auVar14 = vfmadd231ps_fma(auVar200,(undefined1  [16])aVar5,auVar14);
  local_500 = auVar20._0_4_;
  auVar219._4_4_ = local_500;
  auVar219._0_4_ = local_500;
  auVar219._8_4_ = local_500;
  auVar219._12_4_ = local_500;
  aVar5 = pre->ray_space[k].vx.field_0;
  auVar106 = vfmadd231ps_fma(auVar17,(undefined1  [16])aVar5,auVar219);
  local_510 = auVar21._0_4_;
  auVar220._4_4_ = local_510;
  auVar220._0_4_ = local_510;
  auVar220._8_4_ = local_510;
  auVar220._12_4_ = local_510;
  auVar112 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar5,auVar220);
  uVar86 = local_3c0._0_4_;
  auVar221._4_4_ = uVar86;
  auVar221._0_4_ = uVar86;
  auVar221._8_4_ = uVar86;
  auVar221._12_4_ = uVar86;
  auVar129 = vfmadd231ps_fma(auVar18,(undefined1  [16])aVar5,auVar221);
  uVar86 = local_3d0._0_4_;
  auVar222._4_4_ = uVar86;
  auVar222._0_4_ = uVar86;
  auVar222._8_4_ = uVar86;
  auVar222._12_4_ = uVar86;
  auVar130 = vfmadd231ps_fma(auVar174,(undefined1  [16])aVar5,auVar222);
  uVar86 = local_3e0._0_4_;
  auVar223._4_4_ = uVar86;
  auVar223._0_4_ = uVar86;
  auVar223._8_4_ = uVar86;
  auVar223._12_4_ = uVar86;
  auVar131 = vfmadd231ps_fma(auVar19,(undefined1  [16])aVar5,auVar223);
  uVar86 = local_3f0._0_4_;
  auVar224._4_4_ = uVar86;
  auVar224._0_4_ = uVar86;
  auVar224._8_4_ = uVar86;
  auVar224._12_4_ = uVar86;
  auVar105 = vfmadd231ps_fma(auVar105,(undefined1  [16])aVar5,auVar224);
  uVar86 = local_400._0_4_;
  auVar225._4_4_ = uVar86;
  auVar225._0_4_ = uVar86;
  auVar225._8_4_ = uVar86;
  auVar225._12_4_ = uVar86;
  auVar170 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar5,auVar225);
  uVar86 = local_410._0_4_;
  auVar226._4_4_ = uVar86;
  auVar226._0_4_ = uVar86;
  auVar226._8_4_ = uVar86;
  auVar226._12_4_ = uVar86;
  auVar194 = vfmadd231ps_fma(auVar14,(undefined1  [16])aVar5,auVar226);
  auVar17 = vmovlhps_avx(auVar106,auVar131);
  auVar18 = vmovlhps_avx(auVar112,auVar105);
  auVar174 = vmovlhps_avx(auVar129,auVar170);
  auVar19 = vmovlhps_avx(auVar130,auVar194);
  auVar14 = vminps_avx(auVar17,auVar18);
  auVar15 = vminps_avx(auVar174,auVar19);
  auVar16 = vminps_avx(auVar14,auVar15);
  auVar14 = vmaxps_avx(auVar17,auVar18);
  auVar15 = vmaxps_avx(auVar174,auVar19);
  auVar14 = vmaxps_avx(auVar14,auVar15);
  auVar15 = vshufpd_avx(auVar16,auVar16,3);
  auVar16 = vminps_avx(auVar16,auVar15);
  auVar15 = vshufpd_avx(auVar14,auVar14,3);
  auVar15 = vmaxps_avx(auVar14,auVar15);
  auVar14 = vandps_avx(auVar16,auVar345);
  auVar15 = vandps_avx(auVar15,auVar345);
  auVar14 = vmaxps_avx(auVar14,auVar15);
  auVar15 = vmovshdup_avx(auVar14);
  auVar14 = vmaxss_avx(auVar15,auVar14);
  local_2e0 = auVar14._0_4_ * 9.536743e-07;
  auVar227._8_8_ = auVar106._0_8_;
  auVar227._0_8_ = auVar106._0_8_;
  auVar265._8_8_ = auVar112._0_8_;
  auVar265._0_8_ = auVar112._0_8_;
  auVar292._8_8_ = auVar129._0_8_;
  auVar292._0_8_ = auVar129._0_8_;
  auVar333._0_8_ = auVar130._0_8_;
  auVar333._8_8_ = auVar333._0_8_;
  local_3b0 = ZEXT416((uint)local_2e0);
  fStack_2dc = local_2e0;
  fStack_2d8 = local_2e0;
  fStack_2d4 = local_2e0;
  fStack_2d0 = local_2e0;
  fStack_2cc = local_2e0;
  fStack_2c8 = local_2e0;
  fStack_2c4 = local_2e0;
  local_300 = -local_2e0;
  fStack_2fc = local_300;
  fStack_2f8 = local_300;
  fStack_2f4 = local_300;
  fStack_2f0 = local_300;
  fStack_2ec = local_300;
  fStack_2e8 = local_300;
  fStack_2e4 = local_300;
  local_320 = uVar75;
  uStack_31c = uVar75;
  uStack_318 = uVar75;
  uStack_314 = uVar75;
  uStack_310 = uVar75;
  uStack_30c = uVar75;
  uStack_308 = uVar75;
  uStack_304 = uVar75;
  uStack_33c = local_340;
  uStack_338 = local_340;
  uStack_334 = local_340;
  uStack_330 = local_340;
  uStack_32c = local_340;
  uStack_328 = local_340;
  uStack_324 = local_340;
  bVar83 = false;
  uVar76 = 0;
  fVar85 = *(float *)(ray + k * 4 + 0x60);
  auVar14 = vsubps_avx(auVar18,auVar17);
  auVar15 = vsubps_avx(auVar174,auVar18);
  auVar16 = vsubps_avx(auVar19,auVar174);
  local_440 = vsubps_avx(auVar90,auVar22);
  local_450 = vsubps_avx(auVar87,auVar328);
  local_460 = vsubps_avx(auVar88,auVar30);
  _local_470 = vsubps_avx(auVar104,auVar89);
  local_780 = ZEXT816(0x3f80000000000000);
  local_420 = local_780;
  do {
    auVar106 = vshufps_avx(local_780,local_780,0x50);
    auVar158._8_4_ = 0x3f800000;
    auVar158._0_8_ = &DAT_3f8000003f800000;
    auVar158._12_4_ = 0x3f800000;
    auVar166._16_4_ = 0x3f800000;
    auVar166._0_16_ = auVar158;
    auVar166._20_4_ = 0x3f800000;
    auVar166._24_4_ = 0x3f800000;
    auVar166._28_4_ = 0x3f800000;
    auVar112 = vsubps_avx(auVar158,auVar106);
    fVar193 = auVar106._0_4_;
    fVar149 = auVar131._0_4_;
    auVar98._0_4_ = fVar149 * fVar193;
    fVar210 = auVar106._4_4_;
    fVar169 = auVar131._4_4_;
    auVar98._4_4_ = fVar169 * fVar210;
    fVar151 = auVar106._8_4_;
    auVar98._8_4_ = fVar149 * fVar151;
    fVar211 = auVar106._12_4_;
    auVar98._12_4_ = fVar169 * fVar211;
    fVar240 = auVar105._0_4_;
    auVar201._0_4_ = fVar240 * fVar193;
    fVar257 = auVar105._4_4_;
    auVar201._4_4_ = fVar257 * fVar210;
    auVar201._8_4_ = fVar240 * fVar151;
    auVar201._12_4_ = fVar257 * fVar211;
    fVar279 = auVar170._0_4_;
    auVar247._0_4_ = fVar279 * fVar193;
    fVar289 = auVar170._4_4_;
    auVar247._4_4_ = fVar289 * fVar210;
    auVar247._8_4_ = fVar279 * fVar151;
    auVar247._12_4_ = fVar289 * fVar211;
    fVar342 = auVar194._0_4_;
    auVar317._0_4_ = fVar342 * fVar193;
    fVar352 = auVar194._4_4_;
    auVar317._4_4_ = fVar352 * fVar210;
    auVar317._8_4_ = fVar342 * fVar151;
    auVar317._12_4_ = fVar352 * fVar211;
    auVar214 = vfmadd231ps_fma(auVar98,auVar112,auVar227);
    auVar139 = vfmadd231ps_fma(auVar201,auVar112,auVar265);
    auVar215 = vfmadd231ps_fma(auVar247,auVar112,auVar292);
    auVar268 = vfmadd231ps_fma(auVar317,auVar333,auVar112);
    local_6e0 = auVar268._0_4_;
    auVar106 = vmovshdup_avx(local_420);
    fVar193 = local_420._0_4_;
    fVar150 = (auVar106._0_4_ - fVar193) * 0.04761905;
    auVar278._4_4_ = fVar193;
    auVar278._0_4_ = fVar193;
    auVar278._8_4_ = fVar193;
    auVar278._12_4_ = fVar193;
    auVar278._16_4_ = fVar193;
    auVar278._20_4_ = fVar193;
    auVar278._24_4_ = fVar193;
    auVar278._28_4_ = fVar193;
    auVar143._0_8_ = auVar106._0_8_;
    auVar143._8_8_ = auVar143._0_8_;
    auVar143._16_8_ = auVar143._0_8_;
    auVar143._24_8_ = auVar143._0_8_;
    auVar101 = vsubps_avx(auVar143,auVar278);
    uVar86 = auVar214._0_4_;
    auVar357._4_4_ = uVar86;
    auVar357._0_4_ = uVar86;
    auVar357._8_4_ = uVar86;
    auVar357._12_4_ = uVar86;
    auVar357._16_4_ = uVar86;
    auVar357._20_4_ = uVar86;
    auVar357._24_4_ = uVar86;
    auVar357._28_4_ = uVar86;
    auVar106 = vmovshdup_avx(auVar214);
    uVar213 = auVar106._0_8_;
    auVar340._8_8_ = uVar213;
    auVar340._0_8_ = uVar213;
    auVar340._16_8_ = uVar213;
    auVar340._24_8_ = uVar213;
    fVar128 = auVar139._0_4_;
    auVar125._4_4_ = fVar128;
    auVar125._0_4_ = fVar128;
    auVar125._8_4_ = fVar128;
    auVar125._12_4_ = fVar128;
    auVar125._16_4_ = fVar128;
    auVar125._20_4_ = fVar128;
    auVar125._24_4_ = fVar128;
    auVar125._28_4_ = fVar128;
    auVar112 = vmovshdup_avx(auVar139);
    auVar231._0_8_ = auVar112._0_8_;
    auVar231._8_8_ = auVar231._0_8_;
    auVar231._16_8_ = auVar231._0_8_;
    auVar231._24_8_ = auVar231._0_8_;
    fVar190 = auVar215._0_4_;
    auVar315._4_4_ = fVar190;
    auVar315._0_4_ = fVar190;
    auVar315._8_4_ = fVar190;
    auVar315._12_4_ = fVar190;
    auVar315._16_4_ = fVar190;
    auVar315._20_4_ = fVar190;
    auVar315._24_4_ = fVar190;
    auVar315._28_4_ = fVar190;
    auVar129 = vmovshdup_avx(auVar215);
    auVar288._0_8_ = auVar129._0_8_;
    auVar288._8_8_ = auVar288._0_8_;
    auVar288._16_8_ = auVar288._0_8_;
    auVar288._24_8_ = auVar288._0_8_;
    auVar130 = vmovshdup_avx(auVar268);
    auVar258 = vfmadd132ps_fma(auVar101,auVar278,_DAT_02020f20);
    auVar101 = vsubps_avx(auVar166,ZEXT1632(auVar258));
    fVar193 = auVar258._0_4_;
    auVar349._0_4_ = fVar128 * fVar193;
    fVar210 = auVar258._4_4_;
    auVar349._4_4_ = fVar128 * fVar210;
    fVar151 = auVar258._8_4_;
    auVar349._8_4_ = fVar128 * fVar151;
    fVar211 = auVar258._12_4_;
    auVar349._12_4_ = fVar128 * fVar211;
    auVar349._16_4_ = fVar128 * 0.0;
    auVar349._20_4_ = fVar128 * 0.0;
    auVar349._24_4_ = fVar128 * 0.0;
    auVar349._28_4_ = 0;
    auVar258 = vfmadd231ps_fma(auVar349,auVar101,auVar357);
    fVar147 = auVar112._0_4_;
    auVar325._0_4_ = fVar147 * fVar193;
    fVar148 = auVar112._4_4_;
    auVar325._4_4_ = fVar148 * fVar210;
    auVar325._8_4_ = fVar147 * fVar151;
    auVar325._12_4_ = fVar148 * fVar211;
    auVar325._16_4_ = fVar147 * 0.0;
    auVar325._20_4_ = fVar148 * 0.0;
    auVar325._24_4_ = fVar147 * 0.0;
    auVar325._28_4_ = 0;
    auVar259 = vfmadd231ps_fma(auVar325,auVar101,auVar340);
    auVar103._4_4_ = fVar190 * fVar210;
    auVar103._0_4_ = fVar190 * fVar193;
    auVar103._8_4_ = fVar190 * fVar151;
    auVar103._12_4_ = fVar190 * fVar211;
    auVar103._16_4_ = fVar190 * 0.0;
    auVar103._20_4_ = fVar190 * 0.0;
    auVar103._24_4_ = fVar190 * 0.0;
    auVar103._28_4_ = auVar106._4_4_;
    auVar280 = vfmadd231ps_fma(auVar103,auVar101,auVar125);
    fVar147 = auVar129._0_4_;
    fVar148 = auVar129._4_4_;
    auVar24._4_4_ = fVar148 * fVar210;
    auVar24._0_4_ = fVar147 * fVar193;
    auVar24._8_4_ = fVar147 * fVar151;
    auVar24._12_4_ = fVar148 * fVar211;
    auVar24._16_4_ = fVar147 * 0.0;
    auVar24._20_4_ = fVar148 * 0.0;
    auVar24._24_4_ = fVar147 * 0.0;
    auVar24._28_4_ = uVar86;
    auVar181 = vfmadd231ps_fma(auVar24,auVar101,auVar231);
    auVar106 = vshufps_avx(auVar214,auVar214,0xaa);
    auVar232._0_8_ = auVar106._0_8_;
    auVar232._8_8_ = auVar232._0_8_;
    auVar232._16_8_ = auVar232._0_8_;
    auVar232._24_8_ = auVar232._0_8_;
    auVar112 = vshufps_avx(auVar214,auVar214,0xff);
    uStack_738 = auVar112._0_8_;
    local_740 = (undefined1  [8])uStack_738;
    uStack_730 = uStack_738;
    uStack_728 = uStack_738;
    auVar25._4_4_ = fVar210 * local_6e0;
    auVar25._0_4_ = fVar193 * local_6e0;
    auVar25._8_4_ = fVar151 * local_6e0;
    auVar25._12_4_ = fVar211 * local_6e0;
    auVar25._16_4_ = local_6e0 * 0.0;
    auVar25._20_4_ = local_6e0 * 0.0;
    auVar25._24_4_ = local_6e0 * 0.0;
    auVar25._28_4_ = 0x3f800000;
    auVar343 = vfmadd231ps_fma(auVar25,auVar101,auVar315);
    auVar129 = vshufps_avx(auVar139,auVar139,0xaa);
    auVar188._0_8_ = auVar129._0_8_;
    auVar188._8_8_ = auVar188._0_8_;
    auVar188._16_8_ = auVar188._0_8_;
    auVar188._24_8_ = auVar188._0_8_;
    auVar214 = vshufps_avx(auVar139,auVar139,0xff);
    auVar209._0_8_ = auVar214._0_8_;
    auVar209._8_8_ = auVar209._0_8_;
    auVar209._16_8_ = auVar209._0_8_;
    auVar209._24_8_ = auVar209._0_8_;
    fVar147 = auVar130._0_4_;
    fVar148 = auVar130._4_4_;
    auVar26._4_4_ = fVar148 * fVar210;
    auVar26._0_4_ = fVar147 * fVar193;
    auVar26._8_4_ = fVar147 * fVar151;
    auVar26._12_4_ = fVar148 * fVar211;
    auVar26._16_4_ = fVar147 * 0.0;
    auVar26._20_4_ = fVar148 * 0.0;
    auVar26._24_4_ = fVar147 * 0.0;
    auVar26._28_4_ = fVar190;
    auVar344 = vfmadd231ps_fma(auVar26,auVar101,auVar288);
    auVar27._28_4_ = fVar128;
    auVar27._0_28_ =
         ZEXT1628(CONCAT412(auVar280._12_4_ * fVar211,
                            CONCAT48(auVar280._8_4_ * fVar151,
                                     CONCAT44(auVar280._4_4_ * fVar210,auVar280._0_4_ * fVar193))));
    auVar258 = vfmadd231ps_fma(auVar27,auVar101,ZEXT1632(auVar258));
    auVar28._28_4_ = auVar112._4_4_;
    auVar28._0_28_ =
         ZEXT1628(CONCAT412(auVar181._12_4_ * fVar211,
                            CONCAT48(auVar181._8_4_ * fVar151,
                                     CONCAT44(auVar181._4_4_ * fVar210,auVar181._0_4_ * fVar193))));
    auVar259 = vfmadd231ps_fma(auVar28,auVar101,ZEXT1632(auVar259));
    auVar112 = vshufps_avx(auVar215,auVar215,0xaa);
    uVar213 = auVar112._0_8_;
    auVar326._8_8_ = uVar213;
    auVar326._0_8_ = uVar213;
    auVar326._16_8_ = uVar213;
    auVar326._24_8_ = uVar213;
    auVar130 = vshufps_avx(auVar215,auVar215,0xff);
    uVar213 = auVar130._0_8_;
    auVar350._8_8_ = uVar213;
    auVar350._0_8_ = uVar213;
    auVar350._16_8_ = uVar213;
    auVar350._24_8_ = uVar213;
    auVar280 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar211 * auVar343._12_4_,
                                                  CONCAT48(fVar151 * auVar343._8_4_,
                                                           CONCAT44(fVar210 * auVar343._4_4_,
                                                                    fVar193 * auVar343._0_4_)))),
                               auVar101,ZEXT1632(auVar280));
    auVar139 = vshufps_avx(auVar268,auVar268,0xaa);
    auVar215 = vshufps_avx(auVar268,auVar268,0xff);
    local_6e0 = auVar215._0_4_;
    fStack_6dc = auVar215._4_4_;
    auVar29._28_4_ = fStack_6dc;
    auVar29._0_28_ =
         ZEXT1628(CONCAT412(auVar344._12_4_ * fVar211,
                            CONCAT48(auVar344._8_4_ * fVar151,
                                     CONCAT44(auVar344._4_4_ * fVar210,auVar344._0_4_ * fVar193))));
    auVar215 = vfmadd231ps_fma(auVar29,auVar101,ZEXT1632(auVar181));
    auVar268 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar211 * auVar280._12_4_,
                                                  CONCAT48(fVar151 * auVar280._8_4_,
                                                           CONCAT44(fVar210 * auVar280._4_4_,
                                                                    fVar193 * auVar280._0_4_)))),
                               auVar101,ZEXT1632(auVar258));
    auVar103 = vsubps_avx(ZEXT1632(auVar280),ZEXT1632(auVar258));
    auVar258 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar211 * auVar215._12_4_,
                                                  CONCAT48(fVar151 * auVar215._8_4_,
                                                           CONCAT44(fVar210 * auVar215._4_4_,
                                                                    fVar193 * auVar215._0_4_)))),
                               auVar101,ZEXT1632(auVar259));
    auVar102 = vsubps_avx(ZEXT1632(auVar215),ZEXT1632(auVar259));
    fVar290 = fVar150 * auVar103._0_4_ * 3.0;
    fVar299 = fVar150 * auVar103._4_4_ * 3.0;
    auVar327._4_4_ = fVar299;
    auVar327._0_4_ = fVar290;
    fVar300 = fVar150 * auVar103._8_4_ * 3.0;
    auVar327._8_4_ = fVar300;
    fVar301 = fVar150 * auVar103._12_4_ * 3.0;
    auVar327._12_4_ = fVar301;
    fVar302 = fVar150 * auVar103._16_4_ * 3.0;
    auVar327._16_4_ = fVar302;
    fVar303 = fVar150 * auVar103._20_4_ * 3.0;
    auVar327._20_4_ = fVar303;
    fVar304 = fVar150 * auVar103._24_4_ * 3.0;
    auVar327._24_4_ = fVar304;
    auVar327._28_4_ = 0x40400000;
    local_760._0_4_ = fVar150 * auVar102._0_4_ * 3.0;
    local_760._4_4_ = fVar150 * auVar102._4_4_ * 3.0;
    fStack_758 = fVar150 * auVar102._8_4_ * 3.0;
    fStack_754 = fVar150 * auVar102._12_4_ * 3.0;
    fStack_750 = fVar150 * auVar102._16_4_ * 3.0;
    fStack_74c = fVar150 * auVar102._20_4_ * 3.0;
    fStack_748 = fVar150 * auVar102._24_4_ * 3.0;
    fStack_744 = auVar102._28_4_;
    fVar128 = auVar129._0_4_;
    fVar147 = auVar129._4_4_;
    auVar31._4_4_ = fVar147 * fVar210;
    auVar31._0_4_ = fVar128 * fVar193;
    auVar31._8_4_ = fVar128 * fVar151;
    auVar31._12_4_ = fVar147 * fVar211;
    auVar31._16_4_ = fVar128 * 0.0;
    auVar31._20_4_ = fVar147 * 0.0;
    auVar31._24_4_ = fVar128 * 0.0;
    auVar31._28_4_ = auVar103._28_4_;
    auVar129 = vfmadd231ps_fma(auVar31,auVar101,auVar232);
    fVar128 = auVar214._0_4_;
    fVar148 = auVar214._4_4_;
    auVar32._4_4_ = fVar148 * fVar210;
    auVar32._0_4_ = fVar128 * fVar193;
    auVar32._8_4_ = fVar128 * fVar151;
    auVar32._12_4_ = fVar148 * fVar211;
    auVar32._16_4_ = fVar128 * 0.0;
    auVar32._20_4_ = fVar148 * 0.0;
    auVar32._24_4_ = fVar128 * 0.0;
    auVar32._28_4_ = auVar106._4_4_;
    auVar106 = vfmadd231ps_fma(auVar32,auVar101,_local_740);
    fVar128 = auVar112._0_4_;
    fVar148 = auVar112._4_4_;
    auVar33._4_4_ = fVar148 * fVar210;
    auVar33._0_4_ = fVar128 * fVar193;
    auVar33._8_4_ = fVar128 * fVar151;
    auVar33._12_4_ = fVar148 * fVar211;
    auVar33._16_4_ = fVar128 * 0.0;
    auVar33._20_4_ = fVar148 * 0.0;
    auVar33._24_4_ = fVar128 * 0.0;
    auVar33._28_4_ = fVar150;
    auVar112 = vfmadd231ps_fma(auVar33,auVar101,auVar188);
    fVar128 = auVar130._0_4_;
    fVar190 = auVar130._4_4_;
    auVar34._4_4_ = fVar190 * fVar210;
    auVar34._0_4_ = fVar128 * fVar193;
    auVar34._8_4_ = fVar128 * fVar151;
    auVar34._12_4_ = fVar190 * fVar211;
    auVar34._16_4_ = fVar128 * 0.0;
    auVar34._20_4_ = fVar190 * 0.0;
    auVar34._24_4_ = fVar128 * 0.0;
    auVar34._28_4_ = fVar147;
    auVar130 = vfmadd231ps_fma(auVar34,auVar101,auVar209);
    auVar26 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar268));
    fVar128 = auVar139._0_4_;
    fVar147 = auVar139._4_4_;
    auVar35._4_4_ = fVar147 * fVar210;
    auVar35._0_4_ = fVar128 * fVar193;
    auVar35._8_4_ = fVar128 * fVar151;
    auVar35._12_4_ = fVar147 * fVar211;
    auVar35._16_4_ = fVar128 * 0.0;
    auVar35._20_4_ = fVar147 * 0.0;
    auVar35._24_4_ = fVar128 * 0.0;
    auVar35._28_4_ = auVar26._28_4_;
    auVar214 = vfmadd231ps_fma(auVar35,auVar101,auVar326);
    auVar27 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar258));
    auVar36._4_4_ = fVar210 * fStack_6dc;
    auVar36._0_4_ = fVar193 * local_6e0;
    auVar36._8_4_ = fVar151 * local_6e0;
    auVar36._12_4_ = fVar211 * fStack_6dc;
    auVar36._16_4_ = local_6e0 * 0.0;
    auVar36._20_4_ = fStack_6dc * 0.0;
    auVar36._24_4_ = local_6e0 * 0.0;
    auVar36._28_4_ = fVar148;
    auVar139 = vfmadd231ps_fma(auVar36,auVar101,auVar350);
    auVar37._28_4_ = fVar147;
    auVar37._0_28_ =
         ZEXT1628(CONCAT412(fVar211 * auVar112._12_4_,
                            CONCAT48(fVar151 * auVar112._8_4_,
                                     CONCAT44(fVar210 * auVar112._4_4_,fVar193 * auVar112._0_4_))));
    auVar129 = vfmadd231ps_fma(auVar37,auVar101,ZEXT1632(auVar129));
    auVar106 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar211 * auVar130._12_4_,
                                                  CONCAT48(fVar151 * auVar130._8_4_,
                                                           CONCAT44(fVar210 * auVar130._4_4_,
                                                                    fVar193 * auVar130._0_4_)))),
                               auVar101,ZEXT1632(auVar106));
    fVar290 = auVar268._0_4_ + fVar290;
    fVar299 = auVar268._4_4_ + fVar299;
    fVar300 = auVar268._8_4_ + fVar300;
    fVar301 = auVar268._12_4_ + fVar301;
    fVar302 = fVar302 + 0.0;
    fVar303 = fVar303 + 0.0;
    fVar304 = fVar304 + 0.0;
    auVar38._28_4_ = 0x40400000;
    auVar38._0_28_ =
         ZEXT1628(CONCAT412(auVar139._12_4_ * fVar211,
                            CONCAT48(auVar139._8_4_ * fVar151,
                                     CONCAT44(auVar139._4_4_ * fVar210,auVar139._0_4_ * fVar193))));
    auVar112 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar211 * auVar214._12_4_,
                                                  CONCAT48(fVar151 * auVar214._8_4_,
                                                           CONCAT44(fVar210 * auVar214._4_4_,
                                                                    fVar193 * auVar214._0_4_)))),
                               auVar101,ZEXT1632(auVar112));
    auVar130 = vfmadd231ps_fma(auVar38,auVar101,ZEXT1632(auVar130));
    auVar214 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar211 * auVar112._12_4_,
                                                  CONCAT48(fVar151 * auVar112._8_4_,
                                                           CONCAT44(fVar210 * auVar112._4_4_,
                                                                    fVar193 * auVar112._0_4_)))),
                               auVar101,ZEXT1632(auVar129));
    auVar139 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar211 * auVar130._12_4_,
                                                  CONCAT48(fVar151 * auVar130._8_4_,
                                                           CONCAT44(fVar210 * auVar130._4_4_,
                                                                    fVar193 * auVar130._0_4_)))),
                               ZEXT1632(auVar106),auVar101);
    auVar101 = vsubps_avx(ZEXT1632(auVar112),ZEXT1632(auVar129));
    auVar103 = vsubps_avx(ZEXT1632(auVar130),ZEXT1632(auVar106));
    fVar193 = fVar150 * auVar101._0_4_ * 3.0;
    fVar210 = fVar150 * auVar101._4_4_ * 3.0;
    auVar39._4_4_ = fVar210;
    auVar39._0_4_ = fVar193;
    fVar151 = fVar150 * auVar101._8_4_ * 3.0;
    auVar39._8_4_ = fVar151;
    fVar211 = fVar150 * auVar101._12_4_ * 3.0;
    auVar39._12_4_ = fVar211;
    fVar190 = fVar150 * auVar101._16_4_ * 3.0;
    auVar39._16_4_ = fVar190;
    fVar191 = fVar150 * auVar101._20_4_ * 3.0;
    auVar39._20_4_ = fVar191;
    fVar192 = fVar150 * auVar101._24_4_ * 3.0;
    auVar39._24_4_ = fVar192;
    auVar39._28_4_ = 0x40400000;
    auVar256._0_4_ = fVar150 * auVar103._0_4_ * 3.0;
    auVar256._4_4_ = fVar150 * auVar103._4_4_ * 3.0;
    auVar256._8_4_ = fVar150 * auVar103._8_4_ * 3.0;
    auVar256._12_4_ = fVar150 * auVar103._12_4_ * 3.0;
    auVar256._16_4_ = fVar150 * auVar103._16_4_ * 3.0;
    auVar256._20_4_ = fVar150 * auVar103._20_4_ * 3.0;
    auVar256._24_4_ = fVar150 * auVar103._24_4_ * 3.0;
    auVar256._28_4_ = 0;
    auVar28 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar214));
    local_1c0 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar139));
    auVar101 = vsubps_avx(ZEXT1632(auVar214),ZEXT1632(auVar268));
    auVar103 = vsubps_avx(ZEXT1632(auVar139),ZEXT1632(auVar258));
    auVar24 = vsubps_avx(auVar28,auVar26);
    fVar212 = auVar101._0_4_ + auVar24._0_4_;
    fVar234 = auVar101._4_4_ + auVar24._4_4_;
    fVar235 = auVar101._8_4_ + auVar24._8_4_;
    fVar236 = auVar101._12_4_ + auVar24._12_4_;
    fVar237 = auVar101._16_4_ + auVar24._16_4_;
    fVar238 = auVar101._20_4_ + auVar24._20_4_;
    fVar239 = auVar101._24_4_ + auVar24._24_4_;
    auVar25 = vsubps_avx(local_1c0,auVar27);
    auVar341._0_4_ = auVar103._0_4_ + auVar25._0_4_;
    auVar341._4_4_ = auVar103._4_4_ + auVar25._4_4_;
    auVar341._8_4_ = auVar103._8_4_ + auVar25._8_4_;
    auVar341._12_4_ = auVar103._12_4_ + auVar25._12_4_;
    auVar341._16_4_ = auVar103._16_4_ + auVar25._16_4_;
    auVar341._20_4_ = auVar103._20_4_ + auVar25._20_4_;
    auVar341._24_4_ = auVar103._24_4_ + auVar25._24_4_;
    auVar341._28_4_ = auVar103._28_4_ + auVar25._28_4_;
    fVar150 = auVar258._0_4_;
    local_2a0 = fVar150 + (float)local_760._0_4_;
    fVar128 = auVar258._4_4_;
    fStack_29c = fVar128 + (float)local_760._4_4_;
    fVar147 = auVar258._8_4_;
    fStack_298 = fVar147 + fStack_758;
    fVar148 = auVar258._12_4_;
    fStack_294 = fVar148 + fStack_754;
    fStack_290 = fStack_750 + 0.0;
    fStack_28c = fStack_74c + 0.0;
    fStack_288 = fStack_748 + 0.0;
    fStack_284 = auVar102._28_4_ + 0.0;
    local_1e0 = ZEXT1632(auVar268);
    auVar103 = vsubps_avx(local_1e0,auVar327);
    local_220 = vpermps_avx2(_DAT_0205d4a0,auVar103);
    local_200 = ZEXT1632(auVar258);
    auVar103 = vsubps_avx(local_200,_local_760);
    local_2c0 = vpermps_avx2(_DAT_0205d4a0,auVar103);
    local_240._0_4_ = auVar214._0_4_ + fVar193;
    local_240._4_4_ = auVar214._4_4_ + fVar210;
    local_240._8_4_ = auVar214._8_4_ + fVar151;
    local_240._12_4_ = auVar214._12_4_ + fVar211;
    local_240._16_4_ = fVar190 + 0.0;
    local_240._20_4_ = fVar191 + 0.0;
    local_240._24_4_ = fVar192 + 0.0;
    local_240._28_4_ = 0x40400000;
    auVar327 = ZEXT1632(auVar214);
    auVar103 = vsubps_avx(auVar327,auVar39);
    auVar29 = vpermps_avx2(_DAT_0205d4a0,auVar103);
    fVar193 = auVar139._0_4_;
    local_280._0_4_ = fVar193 + auVar256._0_4_;
    fVar210 = auVar139._4_4_;
    local_280._4_4_ = fVar210 + auVar256._4_4_;
    fVar151 = auVar139._8_4_;
    local_280._8_4_ = fVar151 + auVar256._8_4_;
    fVar211 = auVar139._12_4_;
    local_280._12_4_ = fVar211 + auVar256._12_4_;
    local_280._16_4_ = auVar256._16_4_ + 0.0;
    local_280._20_4_ = auVar256._20_4_ + 0.0;
    local_280._24_4_ = auVar256._24_4_ + 0.0;
    local_280._28_4_ = 0;
    auVar103 = vsubps_avx(ZEXT1632(auVar139),auVar256);
    local_260 = vpermps_avx2(_DAT_0205d4a0,auVar103);
    auVar40._4_4_ = fVar128 * fVar234;
    auVar40._0_4_ = fVar150 * fVar212;
    auVar40._8_4_ = fVar147 * fVar235;
    auVar40._12_4_ = fVar148 * fVar236;
    auVar40._16_4_ = fVar237 * 0.0;
    auVar40._20_4_ = fVar238 * 0.0;
    auVar40._24_4_ = fVar239 * 0.0;
    auVar40._28_4_ = auVar103._28_4_;
    auVar106 = vfnmadd231ps_fma(auVar40,local_1e0,auVar341);
    auVar41._4_4_ = fStack_29c * fVar234;
    auVar41._0_4_ = local_2a0 * fVar212;
    auVar41._8_4_ = fStack_298 * fVar235;
    auVar41._12_4_ = fStack_294 * fVar236;
    auVar41._16_4_ = fStack_290 * fVar237;
    auVar41._20_4_ = fStack_28c * fVar238;
    auVar41._24_4_ = fStack_288 * fVar239;
    auVar41._28_4_ = auVar29._28_4_;
    auVar62._4_4_ = fVar299;
    auVar62._0_4_ = fVar290;
    auVar62._8_4_ = fVar300;
    auVar62._12_4_ = fVar301;
    auVar62._16_4_ = fVar302;
    auVar62._20_4_ = fVar303;
    auVar62._24_4_ = fVar304;
    auVar62._28_4_ = 0x40400000;
    auVar112 = vfnmadd231ps_fma(auVar41,auVar341,auVar62);
    auVar42._4_4_ = local_2c0._4_4_ * fVar234;
    auVar42._0_4_ = local_2c0._0_4_ * fVar212;
    auVar42._8_4_ = local_2c0._8_4_ * fVar235;
    auVar42._12_4_ = local_2c0._12_4_ * fVar236;
    auVar42._16_4_ = local_2c0._16_4_ * fVar237;
    auVar42._20_4_ = local_2c0._20_4_ * fVar238;
    auVar42._24_4_ = local_2c0._24_4_ * fVar239;
    auVar42._28_4_ = fStack_284;
    auVar129 = vfnmadd231ps_fma(auVar42,local_220,auVar341);
    local_740._0_4_ = auVar27._0_4_;
    local_740._4_4_ = auVar27._4_4_;
    uStack_738._0_4_ = auVar27._8_4_;
    uStack_738._4_4_ = auVar27._12_4_;
    uStack_730._0_4_ = auVar27._16_4_;
    uStack_730._4_4_ = auVar27._20_4_;
    uStack_728._0_4_ = auVar27._24_4_;
    auVar43._4_4_ = fVar234 * (float)local_740._4_4_;
    auVar43._0_4_ = fVar212 * (float)local_740._0_4_;
    auVar43._8_4_ = fVar235 * (float)uStack_738;
    auVar43._12_4_ = fVar236 * uStack_738._4_4_;
    auVar43._16_4_ = fVar237 * (float)uStack_730;
    auVar43._20_4_ = fVar238 * uStack_730._4_4_;
    auVar43._24_4_ = fVar239 * (float)uStack_728;
    auVar43._28_4_ = local_2c0._28_4_;
    auVar130 = vfnmadd231ps_fma(auVar43,auVar26,auVar341);
    auVar68._4_4_ = fVar210 * fVar234;
    auVar68._0_4_ = fVar193 * fVar212;
    auVar68._8_4_ = fVar151 * fVar235;
    auVar68._12_4_ = fVar211 * fVar236;
    auVar68._16_4_ = fVar237 * 0.0;
    auVar68._20_4_ = fVar238 * 0.0;
    auVar68._24_4_ = fVar239 * 0.0;
    auVar68._28_4_ = DAT_0205d4a0._28_4_;
    auVar214 = vfnmadd231ps_fma(auVar68,auVar327,auVar341);
    auVar44._4_4_ = local_280._4_4_ * fVar234;
    auVar44._0_4_ = local_280._0_4_ * fVar212;
    auVar44._8_4_ = local_280._8_4_ * fVar235;
    auVar44._12_4_ = local_280._12_4_ * fVar236;
    auVar44._16_4_ = local_280._16_4_ * fVar237;
    auVar44._20_4_ = local_280._20_4_ * fVar238;
    auVar44._24_4_ = local_280._24_4_ * fVar239;
    auVar44._28_4_ = auVar26._28_4_;
    auVar215 = vfnmadd231ps_fma(auVar44,local_240,auVar341);
    auVar45._4_4_ = local_260._4_4_ * fVar234;
    auVar45._0_4_ = local_260._0_4_ * fVar212;
    auVar45._8_4_ = local_260._8_4_ * fVar235;
    auVar45._12_4_ = local_260._12_4_ * fVar236;
    auVar45._16_4_ = local_260._16_4_ * fVar237;
    auVar45._20_4_ = local_260._20_4_ * fVar238;
    auVar45._24_4_ = local_260._24_4_ * fVar239;
    auVar45._28_4_ = local_220._28_4_;
    auVar268 = vfnmadd231ps_fma(auVar45,auVar341,auVar29);
    auVar46._4_4_ = local_1c0._4_4_ * fVar234;
    auVar46._0_4_ = local_1c0._0_4_ * fVar212;
    auVar46._8_4_ = local_1c0._8_4_ * fVar235;
    auVar46._12_4_ = local_1c0._12_4_ * fVar236;
    auVar46._16_4_ = local_1c0._16_4_ * fVar237;
    auVar46._20_4_ = local_1c0._20_4_ * fVar238;
    auVar46._24_4_ = local_1c0._24_4_ * fVar239;
    auVar46._28_4_ = auVar101._28_4_ + auVar24._28_4_;
    auVar258 = vfnmadd231ps_fma(auVar46,auVar341,auVar28);
    auVar103 = vminps_avx(ZEXT1632(auVar106),ZEXT1632(auVar112));
    auVar101 = vmaxps_avx(ZEXT1632(auVar106),ZEXT1632(auVar112));
    auVar102 = vminps_avx(ZEXT1632(auVar129),ZEXT1632(auVar130));
    auVar102 = vminps_avx(auVar103,auVar102);
    auVar103 = vmaxps_avx(ZEXT1632(auVar129),ZEXT1632(auVar130));
    auVar101 = vmaxps_avx(auVar101,auVar103);
    auVar24 = vminps_avx(ZEXT1632(auVar214),ZEXT1632(auVar215));
    auVar103 = vmaxps_avx(ZEXT1632(auVar214),ZEXT1632(auVar215));
    auVar25 = vminps_avx(ZEXT1632(auVar268),ZEXT1632(auVar258));
    auVar24 = vminps_avx(auVar24,auVar25);
    auVar24 = vminps_avx(auVar102,auVar24);
    auVar102 = vmaxps_avx(ZEXT1632(auVar268),ZEXT1632(auVar258));
    auVar103 = vmaxps_avx(auVar103,auVar102);
    auVar103 = vmaxps_avx(auVar101,auVar103);
    auVar67._4_4_ = fStack_2dc;
    auVar67._0_4_ = local_2e0;
    auVar67._8_4_ = fStack_2d8;
    auVar67._12_4_ = fStack_2d4;
    auVar67._16_4_ = fStack_2d0;
    auVar67._20_4_ = fStack_2cc;
    auVar67._24_4_ = fStack_2c8;
    auVar67._28_4_ = fStack_2c4;
    auVar101 = vcmpps_avx(auVar24,auVar67,2);
    auVar66._4_4_ = fStack_2fc;
    auVar66._0_4_ = local_300;
    auVar66._8_4_ = fStack_2f8;
    auVar66._12_4_ = fStack_2f4;
    auVar66._16_4_ = fStack_2f0;
    auVar66._20_4_ = fStack_2ec;
    auVar66._24_4_ = fStack_2e8;
    auVar66._28_4_ = fStack_2e4;
    auVar103 = vcmpps_avx(auVar103,auVar66,5);
    auVar101 = vandps_avx(auVar103,auVar101);
    auVar103 = local_3a0 & auVar101;
    uVar73 = 0;
    if ((((((((auVar103 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar103 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar103 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar103 >> 0x7f,0) != '\0') ||
          (auVar103 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar103 >> 0xbf,0) != '\0') ||
        (auVar103 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar103[0x1f] < '\0') {
      auVar103 = vsubps_avx(auVar26,local_1e0);
      auVar102 = vsubps_avx(auVar28,auVar327);
      fVar191 = auVar103._0_4_ + auVar102._0_4_;
      fVar192 = auVar103._4_4_ + auVar102._4_4_;
      fVar212 = auVar103._8_4_ + auVar102._8_4_;
      fVar234 = auVar103._12_4_ + auVar102._12_4_;
      fVar235 = auVar103._16_4_ + auVar102._16_4_;
      fVar236 = auVar103._20_4_ + auVar102._20_4_;
      fVar237 = auVar103._24_4_ + auVar102._24_4_;
      auVar24 = vsubps_avx(auVar27,local_200);
      auVar25 = vsubps_avx(local_1c0,ZEXT1632(auVar139));
      auVar126._0_4_ = auVar24._0_4_ + auVar25._0_4_;
      auVar126._4_4_ = auVar24._4_4_ + auVar25._4_4_;
      auVar126._8_4_ = auVar24._8_4_ + auVar25._8_4_;
      auVar126._12_4_ = auVar24._12_4_ + auVar25._12_4_;
      auVar126._16_4_ = auVar24._16_4_ + auVar25._16_4_;
      auVar126._20_4_ = auVar24._20_4_ + auVar25._20_4_;
      auVar126._24_4_ = auVar24._24_4_ + auVar25._24_4_;
      fVar190 = auVar25._28_4_;
      auVar126._28_4_ = auVar24._28_4_ + fVar190;
      auVar351._0_4_ = fVar150 * fVar191;
      auVar351._4_4_ = fVar128 * fVar192;
      auVar351._8_4_ = fVar147 * fVar212;
      auVar351._12_4_ = fVar148 * fVar234;
      auVar351._16_4_ = fVar235 * 0.0;
      auVar351._20_4_ = fVar236 * 0.0;
      auVar351._24_4_ = fVar237 * 0.0;
      auVar351._28_4_ = 0;
      auVar214 = vfnmadd231ps_fma(auVar351,auVar126,local_1e0);
      auVar47._4_4_ = fVar192 * fStack_29c;
      auVar47._0_4_ = fVar191 * local_2a0;
      auVar47._8_4_ = fVar212 * fStack_298;
      auVar47._12_4_ = fVar234 * fStack_294;
      auVar47._16_4_ = fVar235 * fStack_290;
      auVar47._20_4_ = fVar236 * fStack_28c;
      auVar47._24_4_ = fVar237 * fStack_288;
      auVar47._28_4_ = fVar190;
      auVar63._4_4_ = fVar299;
      auVar63._0_4_ = fVar290;
      auVar63._8_4_ = fVar300;
      auVar63._12_4_ = fVar301;
      auVar63._16_4_ = fVar302;
      auVar63._20_4_ = fVar303;
      auVar63._24_4_ = fVar304;
      auVar63._28_4_ = 0x40400000;
      auVar106 = vfnmadd213ps_fma(auVar63,auVar126,auVar47);
      auVar48._4_4_ = fVar192 * local_2c0._4_4_;
      auVar48._0_4_ = fVar191 * local_2c0._0_4_;
      auVar48._8_4_ = fVar212 * local_2c0._8_4_;
      auVar48._12_4_ = fVar234 * local_2c0._12_4_;
      auVar48._16_4_ = fVar235 * local_2c0._16_4_;
      auVar48._20_4_ = fVar236 * local_2c0._20_4_;
      auVar48._24_4_ = fVar237 * local_2c0._24_4_;
      auVar48._28_4_ = fVar190;
      auVar112 = vfnmadd213ps_fma(local_220,auVar126,auVar48);
      auVar49._4_4_ = (float)local_740._4_4_ * fVar192;
      auVar49._0_4_ = (float)local_740._0_4_ * fVar191;
      auVar49._8_4_ = (float)uStack_738 * fVar212;
      auVar49._12_4_ = uStack_738._4_4_ * fVar234;
      auVar49._16_4_ = (float)uStack_730 * fVar235;
      auVar49._20_4_ = uStack_730._4_4_ * fVar236;
      auVar49._24_4_ = (float)uStack_728 * fVar237;
      auVar49._28_4_ = fVar190;
      auVar139 = vfnmadd231ps_fma(auVar49,auVar126,auVar26);
      auVar144._0_4_ = fVar193 * fVar191;
      auVar144._4_4_ = fVar210 * fVar192;
      auVar144._8_4_ = fVar151 * fVar212;
      auVar144._12_4_ = fVar211 * fVar234;
      auVar144._16_4_ = fVar235 * 0.0;
      auVar144._20_4_ = fVar236 * 0.0;
      auVar144._24_4_ = fVar237 * 0.0;
      auVar144._28_4_ = 0;
      auVar215 = vfnmadd231ps_fma(auVar144,auVar126,auVar327);
      auVar50._4_4_ = fVar192 * local_280._4_4_;
      auVar50._0_4_ = fVar191 * local_280._0_4_;
      auVar50._8_4_ = fVar212 * local_280._8_4_;
      auVar50._12_4_ = fVar234 * local_280._12_4_;
      auVar50._16_4_ = fVar235 * local_280._16_4_;
      auVar50._20_4_ = fVar236 * local_280._20_4_;
      auVar50._24_4_ = fVar237 * local_280._24_4_;
      auVar50._28_4_ = auVar27._28_4_;
      auVar129 = vfnmadd213ps_fma(local_240,auVar126,auVar50);
      auVar51._4_4_ = fVar192 * local_260._4_4_;
      auVar51._0_4_ = fVar191 * local_260._0_4_;
      auVar51._8_4_ = fVar212 * local_260._8_4_;
      auVar51._12_4_ = fVar234 * local_260._12_4_;
      auVar51._16_4_ = fVar235 * local_260._16_4_;
      auVar51._20_4_ = fVar236 * local_260._20_4_;
      auVar51._24_4_ = fVar237 * local_260._24_4_;
      auVar51._28_4_ = auVar27._28_4_;
      auVar130 = vfnmadd213ps_fma(auVar29,auVar126,auVar51);
      auVar52._4_4_ = local_1c0._4_4_ * fVar192;
      auVar52._0_4_ = local_1c0._0_4_ * fVar191;
      auVar52._8_4_ = local_1c0._8_4_ * fVar212;
      auVar52._12_4_ = local_1c0._12_4_ * fVar234;
      auVar52._16_4_ = local_1c0._16_4_ * fVar235;
      auVar52._20_4_ = local_1c0._20_4_ * fVar236;
      auVar52._24_4_ = local_1c0._24_4_ * fVar237;
      auVar52._28_4_ = auVar103._28_4_ + auVar102._28_4_;
      auVar268 = vfnmadd231ps_fma(auVar52,auVar126,auVar28);
      auVar102 = vminps_avx(ZEXT1632(auVar214),ZEXT1632(auVar106));
      auVar103 = vmaxps_avx(ZEXT1632(auVar214),ZEXT1632(auVar106));
      auVar24 = vminps_avx(ZEXT1632(auVar112),ZEXT1632(auVar139));
      auVar24 = vminps_avx(auVar102,auVar24);
      auVar102 = vmaxps_avx(ZEXT1632(auVar112),ZEXT1632(auVar139));
      auVar103 = vmaxps_avx(auVar103,auVar102);
      auVar25 = vminps_avx(ZEXT1632(auVar215),ZEXT1632(auVar129));
      auVar102 = vmaxps_avx(ZEXT1632(auVar215),ZEXT1632(auVar129));
      auVar26 = vminps_avx(ZEXT1632(auVar130),ZEXT1632(auVar268));
      auVar25 = vminps_avx(auVar25,auVar26);
      auVar25 = vminps_avx(auVar24,auVar25);
      auVar24 = vmaxps_avx(ZEXT1632(auVar130),ZEXT1632(auVar268));
      auVar102 = vmaxps_avx(auVar102,auVar24);
      auVar102 = vmaxps_avx(auVar103,auVar102);
      auVar103 = vcmpps_avx(auVar25,auVar67,2);
      auVar102 = vcmpps_avx(auVar102,auVar66,5);
      auVar103 = vandps_avx(auVar102,auVar103);
      auVar101 = vandps_avx(auVar101,local_3a0);
      auVar102 = auVar101 & auVar103;
      if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar102 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar102 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar102 >> 0x7f,0) != '\0') ||
            (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar102 >> 0xbf,0) != '\0') ||
          (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar102[0x1f] < '\0') {
        auVar101 = vandps_avx(auVar103,auVar101);
        uVar73 = vmovmskps_avx(auVar101);
      }
    }
    if (uVar73 != 0) {
      auStack_4e0[uVar76] = uVar73;
      uVar213 = vmovlps_avx(local_420);
      *(undefined8 *)(&uStack_380 + uVar76 * 2) = uVar213;
      uVar81 = vmovlps_avx(local_780);
      auStack_1a0[uVar76] = uVar81;
      uVar76 = (ulong)((int)uVar76 + 1);
    }
    do {
      if ((int)uVar76 == 0) {
        if (bVar83) {
          return local_781;
        }
        uVar86 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar100._4_4_ = uVar86;
        auVar100._0_4_ = uVar86;
        auVar100._8_4_ = uVar86;
        auVar100._12_4_ = uVar86;
        auVar14 = vcmpps_avx(local_430,auVar100,2);
        uVar75 = vmovmskps_avx(auVar14);
        uVar71 = uVar71 & uVar71 + 0xf & uVar75;
        local_781 = uVar71 != 0;
        if (!local_781) {
          return local_781;
        }
        goto LAB_01793d90;
      }
      uVar74 = (int)uVar76 - 1;
      uVar77 = (ulong)uVar74;
      uVar80 = auStack_4e0[uVar77];
      uVar73 = (&uStack_380)[uVar77 * 2];
      fVar193 = afStack_37c[uVar77 * 2];
      iVar72 = 0;
      for (uVar81 = (ulong)uVar80; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x8000000000000000) {
        iVar72 = iVar72 + 1;
      }
      uVar80 = uVar80 - 1 & uVar80;
      if (uVar80 == 0) {
        uVar76 = (ulong)uVar74;
      }
      local_780._8_8_ = 0;
      local_780._0_8_ = auStack_1a0[uVar77];
      auStack_4e0[uVar77] = uVar80;
      fVar210 = (float)(iVar72 + 1) * 0.14285715;
      auVar106 = vfmadd231ss_fma(ZEXT416((uint)(fVar193 * (float)iVar72 * 0.14285715)),
                                 ZEXT416(uVar73),ZEXT416((uint)(1.0 - (float)iVar72 * 0.14285715)));
      auVar112 = vfmadd231ss_fma(ZEXT416((uint)(fVar193 * fVar210)),ZEXT416(uVar73),
                                 ZEXT416((uint)(1.0 - fVar210)));
      auVar233._0_4_ = auVar106._0_4_;
      fVar210 = auVar112._0_4_;
      fVar193 = fVar210 - auVar233._0_4_;
      if (0.16666667 <= fVar193) break;
      auVar129 = vshufps_avx(local_780,local_780,0x50);
      auVar136._8_4_ = 0x3f800000;
      auVar136._0_8_ = &DAT_3f8000003f800000;
      auVar136._12_4_ = 0x3f800000;
      auVar130 = vsubps_avx(auVar136,auVar129);
      fVar151 = auVar129._0_4_;
      auVar159._0_4_ = fVar151 * fVar149;
      fVar211 = auVar129._4_4_;
      auVar159._4_4_ = fVar211 * fVar169;
      fVar150 = auVar129._8_4_;
      auVar159._8_4_ = fVar150 * fVar149;
      fVar128 = auVar129._12_4_;
      auVar159._12_4_ = fVar128 * fVar169;
      auVar179._0_4_ = fVar151 * fVar240;
      auVar179._4_4_ = fVar211 * fVar257;
      auVar179._8_4_ = fVar150 * fVar240;
      auVar179._12_4_ = fVar128 * fVar257;
      auVar202._0_4_ = fVar151 * fVar279;
      auVar202._4_4_ = fVar211 * fVar289;
      auVar202._8_4_ = fVar150 * fVar279;
      auVar202._12_4_ = fVar128 * fVar289;
      auVar118._0_4_ = fVar151 * fVar342;
      auVar118._4_4_ = fVar211 * fVar352;
      auVar118._8_4_ = fVar150 * fVar342;
      auVar118._12_4_ = fVar128 * fVar352;
      auVar129 = vfmadd231ps_fma(auVar159,auVar130,auVar227);
      auVar214 = vfmadd231ps_fma(auVar179,auVar130,auVar265);
      auVar139 = vfmadd231ps_fma(auVar202,auVar130,auVar292);
      auVar130 = vfmadd231ps_fma(auVar118,auVar130,auVar333);
      auVar145._16_16_ = auVar129;
      auVar145._0_16_ = auVar129;
      auVar167._16_16_ = auVar214;
      auVar167._0_16_ = auVar214;
      auVar189._16_16_ = auVar139;
      auVar189._0_16_ = auVar139;
      auVar233._4_4_ = auVar233._0_4_;
      auVar233._8_4_ = auVar233._0_4_;
      auVar233._12_4_ = auVar233._0_4_;
      auVar233._20_4_ = fVar210;
      auVar233._16_4_ = fVar210;
      auVar233._24_4_ = fVar210;
      auVar233._28_4_ = fVar210;
      auVar101 = vsubps_avx(auVar167,auVar145);
      auVar214 = vfmadd213ps_fma(auVar101,auVar233,auVar145);
      auVar101 = vsubps_avx(auVar189,auVar167);
      auVar215 = vfmadd213ps_fma(auVar101,auVar233,auVar167);
      auVar129 = vsubps_avx(auVar130,auVar139);
      auVar168._16_16_ = auVar129;
      auVar168._0_16_ = auVar129;
      auVar129 = vfmadd213ps_fma(auVar168,auVar233,auVar189);
      auVar101 = vsubps_avx(ZEXT1632(auVar215),ZEXT1632(auVar214));
      auVar130 = vfmadd213ps_fma(auVar101,auVar233,ZEXT1632(auVar214));
      auVar101 = vsubps_avx(ZEXT1632(auVar129),ZEXT1632(auVar215));
      auVar129 = vfmadd213ps_fma(auVar101,auVar233,ZEXT1632(auVar215));
      auVar101 = vsubps_avx(ZEXT1632(auVar129),ZEXT1632(auVar130));
      auVar259 = vfmadd231ps_fma(ZEXT1632(auVar130),auVar101,auVar233);
      fVar148 = auVar101._4_4_ * 3.0;
      fVar147 = fVar193 * 0.33333334;
      auVar293._0_8_ =
           CONCAT44(auVar259._4_4_ + fVar147 * fVar148,
                    auVar259._0_4_ + fVar147 * auVar101._0_4_ * 3.0);
      auVar293._8_4_ = auVar259._8_4_ + fVar147 * auVar101._8_4_ * 3.0;
      auVar293._12_4_ = auVar259._12_4_ + fVar147 * auVar101._12_4_ * 3.0;
      auVar130 = vshufpd_avx(auVar259,auVar259,3);
      auVar214 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar129 = vsubps_avx(auVar130,auVar259);
      auVar139 = vsubps_avx(auVar214,(undefined1  [16])0x0);
      auVar137._0_4_ = auVar129._0_4_ + auVar139._0_4_;
      auVar137._4_4_ = auVar129._4_4_ + auVar139._4_4_;
      auVar137._8_4_ = auVar129._8_4_ + auVar139._8_4_;
      auVar137._12_4_ = auVar129._12_4_ + auVar139._12_4_;
      auVar129 = vshufps_avx(auVar259,auVar259,0xb1);
      auVar139 = vshufps_avx(auVar293,auVar293,0xb1);
      auVar334._4_4_ = auVar137._0_4_;
      auVar334._0_4_ = auVar137._0_4_;
      auVar334._8_4_ = auVar137._0_4_;
      auVar334._12_4_ = auVar137._0_4_;
      auVar215 = vshufps_avx(auVar137,auVar137,0x55);
      fVar151 = auVar215._0_4_;
      auVar248._0_4_ = auVar129._0_4_ * fVar151;
      fVar211 = auVar215._4_4_;
      auVar248._4_4_ = auVar129._4_4_ * fVar211;
      fVar150 = auVar215._8_4_;
      auVar248._8_4_ = auVar129._8_4_ * fVar150;
      fVar128 = auVar215._12_4_;
      auVar248._12_4_ = auVar129._12_4_ * fVar128;
      auVar266._0_4_ = auVar139._0_4_ * fVar151;
      auVar266._4_4_ = auVar139._4_4_ * fVar211;
      auVar266._8_4_ = auVar139._8_4_ * fVar150;
      auVar266._12_4_ = auVar139._12_4_ * fVar128;
      auVar268 = vfmadd231ps_fma(auVar248,auVar334,auVar259);
      auVar258 = vfmadd231ps_fma(auVar266,auVar334,auVar293);
      auVar139 = vshufps_avx(auVar268,auVar268,0xe8);
      auVar215 = vshufps_avx(auVar258,auVar258,0xe8);
      auVar129 = vcmpps_avx(auVar139,auVar215,1);
      uVar73 = vextractps_avx(auVar129,0);
      auVar280 = auVar258;
      if ((uVar73 & 1) == 0) {
        auVar280 = auVar268;
      }
      auVar180._0_4_ = fVar147 * auVar101._16_4_ * 3.0;
      auVar180._4_4_ = fVar147 * fVar148;
      auVar180._8_4_ = fVar147 * auVar101._24_4_ * 3.0;
      auVar180._12_4_ = fVar147 * fVar210;
      auVar23 = vsubps_avx((undefined1  [16])0x0,auVar180);
      auVar181 = vshufps_avx(auVar23,auVar23,0xb1);
      auVar343 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar354._0_4_ = auVar181._0_4_ * fVar151;
      auVar354._4_4_ = auVar181._4_4_ * fVar211;
      auVar354._8_4_ = auVar181._8_4_ * fVar150;
      auVar354._12_4_ = auVar181._12_4_ * fVar128;
      auVar138._0_4_ = auVar343._0_4_ * fVar151;
      auVar138._4_4_ = auVar343._4_4_ * fVar211;
      auVar138._8_4_ = auVar343._8_4_ * fVar150;
      auVar138._12_4_ = auVar343._12_4_ * fVar128;
      auVar91 = vfmadd231ps_fma(auVar354,auVar334,auVar23);
      auVar92 = vfmadd231ps_fma(auVar138,(undefined1  [16])0x0,auVar334);
      auVar343 = vshufps_avx(auVar91,auVar91,0xe8);
      auVar344 = vshufps_avx(auVar92,auVar92,0xe8);
      auVar181 = vcmpps_avx(auVar343,auVar344,1);
      uVar73 = vextractps_avx(auVar181,0);
      auVar93 = auVar92;
      if ((uVar73 & 1) == 0) {
        auVar93 = auVar91;
      }
      auVar280 = vmaxss_avx(auVar93,auVar280);
      auVar139 = vminps_avx(auVar139,auVar215);
      auVar215 = vminps_avx(auVar343,auVar344);
      auVar215 = vminps_avx(auVar139,auVar215);
      auVar129 = vshufps_avx(auVar129,auVar129,0x55);
      auVar129 = vblendps_avx(auVar129,auVar181,2);
      auVar181 = vpslld_avx(auVar129,0x1f);
      auVar129 = vshufpd_avx(auVar258,auVar258,1);
      auVar129 = vinsertps_avx(auVar129,auVar92,0x9c);
      auVar139 = vshufpd_avx(auVar268,auVar268,1);
      auVar139 = vinsertps_avx(auVar139,auVar91,0x9c);
      auVar129 = vblendvps_avx(auVar139,auVar129,auVar181);
      auVar139 = vmovshdup_avx(auVar129);
      auVar129 = vmaxss_avx(auVar139,auVar129);
      fVar150 = auVar215._0_4_;
      auVar139 = vmovshdup_avx(auVar215);
      fVar211 = auVar129._0_4_;
      fVar151 = auVar280._0_4_;
      if ((0.0001 <= fVar150) || (fVar211 <= -0.0001)) {
        auVar268 = vcmpps_avx(auVar139,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar258 = vcmpps_avx(auVar215,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar268 = vorps_avx(auVar258,auVar268);
        if ((-0.0001 < fVar151 & auVar268[0]) != 0) goto LAB_0179535e;
        auVar268 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar129,5);
        auVar258 = vcmpps_avx(auVar139,SUB6416(ZEXT464(0x38d1b717),0),5);
        auVar268 = vorps_avx(auVar258,auVar268);
        if ((auVar268 & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_0179535e;
LAB_01795e3f:
        bVar53 = true;
      }
      else {
LAB_0179535e:
        auVar258 = vcmpps_avx(auVar215,_DAT_01feba10,1);
        auVar181 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar268 = vcmpss_avx(auVar280,ZEXT816(0) << 0x20,1);
        auVar203._8_4_ = 0x3f800000;
        auVar203._0_8_ = &DAT_3f8000003f800000;
        auVar203._12_4_ = 0x3f800000;
        auVar267._8_4_ = 0xbf800000;
        auVar267._0_8_ = 0xbf800000bf800000;
        auVar267._12_4_ = 0xbf800000;
        auVar268 = vblendvps_avx(auVar203,auVar267,auVar268);
        auVar258 = vblendvps_avx(auVar203,auVar267,auVar258);
        fVar128 = auVar258._0_4_;
        fVar147 = auVar268._0_4_;
        auVar268 = SUB6416(ZEXT864(0),0) << 0x20;
        if ((fVar128 == fVar147) && (!NAN(fVar128) && !NAN(fVar147))) {
          auVar268 = SUB6416(ZEXT464(0x7f800000),0);
        }
        if ((fVar128 == fVar147) && (!NAN(fVar128) && !NAN(fVar147))) {
          auVar181 = SUB6416(ZEXT464(0xff800000),0);
        }
        auVar258 = vmovshdup_avx(auVar258);
        fVar148 = auVar258._0_4_;
        auVar258 = SUB6416(ZEXT464(0x3f800000),0);
        if ((fVar128 != fVar148) || (NAN(fVar128) || NAN(fVar148))) {
          fVar128 = auVar139._0_4_;
          if ((fVar128 != fVar150) || (NAN(fVar128) || NAN(fVar150))) {
            auVar140._0_8_ = auVar215._0_8_ ^ 0x8000000080000000;
            auVar140._8_4_ = auVar215._8_4_ ^ 0x80000000;
            auVar140._12_4_ = auVar215._12_4_ ^ 0x80000000;
            auVar182._0_4_ = -fVar150 / (fVar128 - fVar150);
            auVar182._4_12_ = auVar140._4_12_;
            auVar55._12_4_ = 0;
            auVar55._0_12_ = ZEXT812(0);
            auVar204._12_4_ = 0;
            auVar204._0_12_ = ZEXT812(0);
            auVar204 = auVar204 << 0x20;
            auVar139 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar182._0_4_)),auVar55 << 0x20,
                                       auVar182);
            auVar215 = auVar139;
          }
          else {
            auVar139 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar150 == 0.0) && (auVar139 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar150))) {
              auVar139 = ZEXT816(0);
            }
            auVar204 = ZEXT816(0) << 0x20;
            auVar215 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar150 == 0.0) && (auVar215 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar150))) {
              auVar215 = auVar258;
            }
          }
          auVar268 = vminss_avx(auVar268,auVar139);
          auVar181 = vmaxss_avx(auVar215,auVar181);
        }
        else {
          auVar204 = ZEXT816(0) << 0x20;
        }
        auVar129 = vcmpss_avx(auVar129,auVar204,1);
        auVar183._8_4_ = 0x3f800000;
        auVar183._0_8_ = &DAT_3f8000003f800000;
        auVar183._12_4_ = 0x3f800000;
        auVar318._8_4_ = 0xbf800000;
        auVar318._0_8_ = 0xbf800000bf800000;
        auVar318._12_4_ = 0xbf800000;
        auVar129 = vblendvps_avx(auVar183,auVar318,auVar129);
        fVar150 = auVar129._0_4_;
        if ((fVar147 != fVar150) || (NAN(fVar147) || NAN(fVar150))) {
          if ((fVar211 != fVar151) || (NAN(fVar211) || NAN(fVar151))) {
            auVar141._0_8_ = auVar280._0_8_ ^ 0x8000000080000000;
            auVar141._8_4_ = auVar280._8_4_ ^ 0x80000000;
            auVar141._12_4_ = auVar280._12_4_ ^ 0x80000000;
            auVar184._0_4_ = -fVar151 / (fVar211 - fVar151);
            auVar184._4_12_ = auVar141._4_12_;
            auVar129 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar184._0_4_)),auVar204,auVar184);
            auVar139 = auVar129;
          }
          else {
            auVar129 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar151 == 0.0) && (auVar129 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar151))) {
              auVar129 = ZEXT816(0);
            }
            auVar139 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar151 == 0.0) && (auVar139 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar151))) {
              auVar139 = auVar258;
            }
          }
          auVar268 = vminss_avx(auVar268,auVar129);
          auVar181 = vmaxss_avx(auVar139,auVar181);
        }
        if ((fVar148 != fVar150) || (NAN(fVar148) || NAN(fVar150))) {
          auVar268 = vminss_avx(auVar268,auVar258);
          auVar181 = vmaxss_avx(auVar258,auVar181);
        }
        auVar129 = vmaxss_avx(auVar204,auVar268);
        auVar139 = vminss_avx(auVar181,auVar258);
        bVar53 = true;
        if (auVar129._0_4_ <= auVar139._0_4_) {
          auVar129 = vmaxss_avx(auVar204,ZEXT416((uint)(auVar129._0_4_ + -0.1)));
          auVar139 = vminss_avx(ZEXT416((uint)(auVar139._0_4_ + 0.1)),auVar258);
          auVar119._0_8_ = auVar259._0_8_;
          auVar119._8_8_ = auVar119._0_8_;
          auVar269._8_8_ = auVar293._0_8_;
          auVar269._0_8_ = auVar293._0_8_;
          auVar284._8_8_ = auVar23._0_8_;
          auVar284._0_8_ = auVar23._0_8_;
          auVar215 = vshufpd_avx(auVar293,auVar293,3);
          auVar268 = vshufpd_avx(auVar23,auVar23,3);
          auVar258 = vshufps_avx(auVar129,auVar139,0);
          auVar160._8_4_ = 0x3f800000;
          auVar160._0_8_ = &DAT_3f8000003f800000;
          auVar160._12_4_ = 0x3f800000;
          auVar259 = vsubps_avx(auVar160,auVar258);
          local_760._0_4_ = auVar130._0_4_;
          local_760._4_4_ = auVar130._4_4_;
          fStack_758 = auVar130._8_4_;
          fStack_754 = auVar130._12_4_;
          fVar151 = auVar258._0_4_;
          auVar161._0_4_ = fVar151 * (float)local_760._0_4_;
          fVar211 = auVar258._4_4_;
          auVar161._4_4_ = fVar211 * (float)local_760._4_4_;
          fVar150 = auVar258._8_4_;
          auVar161._8_4_ = fVar150 * fStack_758;
          fVar128 = auVar258._12_4_;
          auVar161._12_4_ = fVar128 * fStack_754;
          auVar185._0_4_ = auVar215._0_4_ * fVar151;
          auVar185._4_4_ = auVar215._4_4_ * fVar211;
          auVar185._8_4_ = auVar215._8_4_ * fVar150;
          auVar185._12_4_ = auVar215._12_4_ * fVar128;
          auVar205._0_4_ = auVar268._0_4_ * fVar151;
          auVar205._4_4_ = auVar268._4_4_ * fVar211;
          auVar205._8_4_ = auVar268._8_4_ * fVar150;
          auVar205._12_4_ = auVar268._12_4_ * fVar128;
          local_740._0_4_ = auVar214._0_4_;
          local_740._4_4_ = auVar214._4_4_;
          uStack_738._0_4_ = auVar214._8_4_;
          uStack_738._4_4_ = auVar214._12_4_;
          auVar228._0_4_ = fVar151 * (float)local_740._0_4_;
          auVar228._4_4_ = fVar211 * (float)local_740._4_4_;
          auVar228._8_4_ = fVar150 * (float)uStack_738;
          auVar228._12_4_ = fVar128 * uStack_738._4_4_;
          auVar215 = vfmadd231ps_fma(auVar161,auVar259,auVar119);
          auVar268 = vfmadd231ps_fma(auVar185,auVar259,auVar269);
          auVar258 = vfmadd231ps_fma(auVar205,auVar259,auVar284);
          auVar259 = vfmadd231ps_fma(auVar228,auVar259,ZEXT816(0));
          auVar130 = vmovshdup_avx(local_780);
          auVar343 = vfmadd231ss_fma(ZEXT416((uint)(auVar130._0_4_ * auVar129._0_4_)),local_780,
                                     ZEXT416((uint)(1.0 - auVar129._0_4_)));
          auVar344 = vfmadd231ss_fma(ZEXT416((uint)(auVar130._0_4_ * auVar139._0_4_)),local_780,
                                     ZEXT416((uint)(1.0 - auVar139._0_4_)));
          fVar151 = 1.0 / fVar193;
          auVar129 = vsubps_avx(auVar268,auVar215);
          auVar249._0_4_ = auVar129._0_4_ * 3.0;
          auVar249._4_4_ = auVar129._4_4_ * 3.0;
          auVar249._8_4_ = auVar129._8_4_ * 3.0;
          auVar249._12_4_ = auVar129._12_4_ * 3.0;
          auVar129 = vsubps_avx(auVar258,auVar268);
          auVar270._0_4_ = auVar129._0_4_ * 3.0;
          auVar270._4_4_ = auVar129._4_4_ * 3.0;
          auVar270._8_4_ = auVar129._8_4_ * 3.0;
          auVar270._12_4_ = auVar129._12_4_ * 3.0;
          auVar129 = vsubps_avx(auVar259,auVar258);
          auVar285._0_4_ = auVar129._0_4_ * 3.0;
          auVar285._4_4_ = auVar129._4_4_ * 3.0;
          auVar285._8_4_ = auVar129._8_4_ * 3.0;
          auVar285._12_4_ = auVar129._12_4_ * 3.0;
          auVar130 = vminps_avx(auVar270,auVar285);
          auVar129 = vmaxps_avx(auVar270,auVar285);
          auVar130 = vminps_avx(auVar249,auVar130);
          auVar129 = vmaxps_avx(auVar249,auVar129);
          auVar214 = vshufpd_avx(auVar130,auVar130,3);
          auVar139 = vshufpd_avx(auVar129,auVar129,3);
          auVar130 = vminps_avx(auVar130,auVar214);
          auVar129 = vmaxps_avx(auVar129,auVar139);
          auVar271._0_4_ = auVar130._0_4_ * fVar151;
          auVar271._4_4_ = auVar130._4_4_ * fVar151;
          auVar271._8_4_ = auVar130._8_4_ * fVar151;
          auVar271._12_4_ = auVar130._12_4_ * fVar151;
          auVar250._0_4_ = fVar151 * auVar129._0_4_;
          auVar250._4_4_ = fVar151 * auVar129._4_4_;
          auVar250._8_4_ = fVar151 * auVar129._8_4_;
          auVar250._12_4_ = fVar151 * auVar129._12_4_;
          fVar151 = 1.0 / (auVar344._0_4_ - auVar343._0_4_);
          auVar129 = vshufpd_avx(auVar215,auVar215,3);
          auVar130 = vshufpd_avx(auVar268,auVar268,3);
          auVar214 = vshufpd_avx(auVar258,auVar258,3);
          auVar139 = vshufpd_avx(auVar259,auVar259,3);
          auVar129 = vsubps_avx(auVar129,auVar215);
          auVar215 = vsubps_avx(auVar130,auVar268);
          auVar268 = vsubps_avx(auVar214,auVar258);
          auVar139 = vsubps_avx(auVar139,auVar259);
          auVar130 = vminps_avx(auVar129,auVar215);
          auVar129 = vmaxps_avx(auVar129,auVar215);
          auVar214 = vminps_avx(auVar268,auVar139);
          auVar214 = vminps_avx(auVar130,auVar214);
          auVar130 = vmaxps_avx(auVar268,auVar139);
          auVar129 = vmaxps_avx(auVar129,auVar130);
          auVar310._0_4_ = fVar151 * auVar214._0_4_;
          auVar310._4_4_ = fVar151 * auVar214._4_4_;
          auVar310._8_4_ = fVar151 * auVar214._8_4_;
          auVar310._12_4_ = fVar151 * auVar214._12_4_;
          auVar294._0_4_ = fVar151 * auVar129._0_4_;
          auVar294._4_4_ = fVar151 * auVar129._4_4_;
          auVar294._8_4_ = fVar151 * auVar129._8_4_;
          auVar294._12_4_ = fVar151 * auVar129._12_4_;
          auVar139 = vinsertps_avx(auVar106,auVar343,0x10);
          auVar215 = vinsertps_avx(auVar112,auVar344,0x10);
          auVar99._0_4_ = (auVar139._0_4_ + auVar215._0_4_) * 0.5;
          auVar99._4_4_ = (auVar139._4_4_ + auVar215._4_4_) * 0.5;
          auVar99._8_4_ = (auVar139._8_4_ + auVar215._8_4_) * 0.5;
          auVar99._12_4_ = (auVar139._12_4_ + auVar215._12_4_) * 0.5;
          auVar162._4_4_ = auVar99._0_4_;
          auVar162._0_4_ = auVar99._0_4_;
          auVar162._8_4_ = auVar99._0_4_;
          auVar162._12_4_ = auVar99._0_4_;
          auVar129 = vfmadd213ps_fma(auVar14,auVar162,auVar17);
          auVar130 = vfmadd213ps_fma(auVar15,auVar162,auVar18);
          auVar214 = vfmadd213ps_fma(auVar16,auVar162,auVar174);
          auVar112 = vsubps_avx(auVar130,auVar129);
          auVar129 = vfmadd213ps_fma(auVar112,auVar162,auVar129);
          auVar112 = vsubps_avx(auVar214,auVar130);
          auVar112 = vfmadd213ps_fma(auVar112,auVar162,auVar130);
          auVar112 = vsubps_avx(auVar112,auVar129);
          auVar129 = vfmadd231ps_fma(auVar129,auVar112,auVar162);
          auVar163._0_8_ = CONCAT44(auVar112._4_4_ * 3.0,auVar112._0_4_ * 3.0);
          auVar163._8_4_ = auVar112._8_4_ * 3.0;
          auVar163._12_4_ = auVar112._12_4_ * 3.0;
          auVar286._8_8_ = auVar129._0_8_;
          auVar286._0_8_ = auVar129._0_8_;
          auVar112 = vshufpd_avx(auVar129,auVar129,3);
          auVar129 = vshufps_avx(auVar99,auVar99,0x55);
          auVar268 = vsubps_avx(auVar112,auVar286);
          auVar259 = vfmadd231ps_fma(auVar286,auVar129,auVar268);
          auVar335._8_8_ = auVar163._0_8_;
          auVar335._0_8_ = auVar163._0_8_;
          auVar112 = vshufpd_avx(auVar163,auVar163,3);
          auVar112 = vsubps_avx(auVar112,auVar335);
          auVar258 = vfmadd213ps_fma(auVar112,auVar129,auVar335);
          auVar129 = vmovshdup_avx(auVar258);
          auVar336._0_8_ = auVar129._0_8_ ^ 0x8000000080000000;
          auVar336._8_4_ = auVar129._8_4_ ^ 0x80000000;
          auVar336._12_4_ = auVar129._12_4_ ^ 0x80000000;
          auVar130 = vmovshdup_avx(auVar268);
          auVar112 = vunpcklps_avx(auVar130,auVar336);
          auVar214 = vshufps_avx(auVar112,auVar336,4);
          auVar355._0_8_ = auVar268._0_8_ ^ 0x8000000080000000;
          auVar355._8_4_ = auVar268._8_4_ ^ 0x80000000;
          auVar355._12_4_ = auVar268._12_4_ ^ 0x80000000;
          auVar112 = vmovlhps_avx(auVar355,auVar258);
          auVar112 = vshufps_avx(auVar112,auVar258,8);
          auVar129 = vfmsub231ss_fma(ZEXT416((uint)(auVar129._0_4_ * auVar268._0_4_)),auVar130,
                                     auVar258);
          auVar186._0_4_ = auVar129._0_4_;
          auVar186._4_4_ = auVar186._0_4_;
          auVar186._8_4_ = auVar186._0_4_;
          auVar186._12_4_ = auVar186._0_4_;
          auVar129 = vdivps_avx(auVar214,auVar186);
          auVar130 = vdivps_avx(auVar112,auVar186);
          fVar150 = auVar259._0_4_;
          fVar151 = auVar129._0_4_;
          auVar112 = vshufps_avx(auVar259,auVar259,0x55);
          fVar211 = auVar130._0_4_;
          local_740._4_4_ = fVar150 * auVar129._4_4_ + auVar112._4_4_ * auVar130._4_4_;
          local_740._0_4_ = fVar150 * fVar151 + auVar112._0_4_ * fVar211;
          uStack_738._0_4_ = fVar150 * auVar129._8_4_ + auVar112._8_4_ * auVar130._8_4_;
          uStack_738._4_4_ = fVar150 * auVar129._12_4_ + auVar112._12_4_ * auVar130._12_4_;
          auVar268 = vmovshdup_avx(auVar129);
          auVar112 = vinsertps_avx(auVar271,auVar310,0x1c);
          auVar348._0_4_ = auVar268._0_4_ * auVar112._0_4_;
          auVar348._4_4_ = auVar268._4_4_ * auVar112._4_4_;
          auVar348._8_4_ = auVar268._8_4_ * auVar112._8_4_;
          auVar348._12_4_ = auVar268._12_4_ * auVar112._12_4_;
          auVar214 = vinsertps_avx(auVar250,auVar294,0x1c);
          auVar319._0_4_ = auVar268._0_4_ * auVar214._0_4_;
          auVar319._4_4_ = auVar268._4_4_ * auVar214._4_4_;
          auVar319._8_4_ = auVar268._8_4_ * auVar214._8_4_;
          auVar319._12_4_ = auVar268._12_4_ * auVar214._12_4_;
          auVar280 = vminps_avx(auVar348,auVar319);
          auVar259 = vmaxps_avx(auVar319,auVar348);
          auVar268 = vinsertps_avx(auVar310,auVar271,0x4c);
          auVar181 = vmovshdup_avx(auVar130);
          auVar258 = vinsertps_avx(auVar294,auVar250,0x4c);
          auVar295._0_4_ = auVar181._0_4_ * auVar268._0_4_;
          auVar295._4_4_ = auVar181._4_4_ * auVar268._4_4_;
          auVar295._8_4_ = auVar181._8_4_ * auVar268._8_4_;
          auVar295._12_4_ = auVar181._12_4_ * auVar268._12_4_;
          auVar311._0_4_ = auVar181._0_4_ * auVar258._0_4_;
          auVar311._4_4_ = auVar181._4_4_ * auVar258._4_4_;
          auVar311._8_4_ = auVar181._8_4_ * auVar258._8_4_;
          auVar311._12_4_ = auVar181._12_4_ * auVar258._12_4_;
          auVar181 = vminps_avx(auVar295,auVar311);
          auVar120._0_4_ = auVar181._0_4_ + auVar280._0_4_;
          auVar120._4_4_ = auVar181._4_4_ + auVar280._4_4_;
          auVar120._8_4_ = auVar181._8_4_ + auVar280._8_4_;
          auVar120._12_4_ = auVar181._12_4_ + auVar280._12_4_;
          auVar280 = vmaxps_avx(auVar311,auVar295);
          auVar296._0_4_ = auVar259._0_4_ + auVar280._0_4_;
          auVar296._4_4_ = auVar259._4_4_ + auVar280._4_4_;
          auVar296._8_4_ = auVar259._8_4_ + auVar280._8_4_;
          auVar296._12_4_ = auVar259._12_4_ + auVar280._12_4_;
          auVar312._8_8_ = 0x3f80000000000000;
          auVar312._0_8_ = 0x3f80000000000000;
          auVar259 = vsubps_avx(auVar312,auVar296);
          auVar280 = vsubps_avx(auVar312,auVar120);
          auVar181 = vsubps_avx(auVar139,auVar99);
          auVar337._0_4_ = fVar151 * auVar112._0_4_;
          auVar337._4_4_ = fVar151 * auVar112._4_4_;
          auVar337._8_4_ = fVar151 * auVar112._8_4_;
          auVar337._12_4_ = fVar151 * auVar112._12_4_;
          auVar320._0_4_ = fVar151 * auVar214._0_4_;
          auVar320._4_4_ = fVar151 * auVar214._4_4_;
          auVar320._8_4_ = fVar151 * auVar214._8_4_;
          auVar320._12_4_ = fVar151 * auVar214._12_4_;
          auVar214 = vminps_avx(auVar337,auVar320);
          auVar112 = vmaxps_avx(auVar320,auVar337);
          auVar272._0_4_ = fVar211 * auVar268._0_4_;
          auVar272._4_4_ = fVar211 * auVar268._4_4_;
          auVar272._8_4_ = fVar211 * auVar268._8_4_;
          auVar272._12_4_ = fVar211 * auVar268._12_4_;
          auVar251._0_4_ = fVar211 * auVar258._0_4_;
          auVar251._4_4_ = fVar211 * auVar258._4_4_;
          auVar251._8_4_ = fVar211 * auVar258._8_4_;
          auVar251._12_4_ = fVar211 * auVar258._12_4_;
          auVar268 = vminps_avx(auVar272,auVar251);
          auVar338._0_4_ = auVar214._0_4_ + auVar268._0_4_;
          auVar338._4_4_ = auVar214._4_4_ + auVar268._4_4_;
          auVar338._8_4_ = auVar214._8_4_ + auVar268._8_4_;
          auVar338._12_4_ = auVar214._12_4_ + auVar268._12_4_;
          auVar268 = vsubps_avx(auVar215,auVar99);
          auVar214 = vmaxps_avx(auVar251,auVar272);
          fVar150 = auVar181._0_4_;
          auVar273._0_4_ = fVar150 * auVar259._0_4_;
          fVar128 = auVar181._4_4_;
          auVar273._4_4_ = fVar128 * auVar259._4_4_;
          fVar147 = auVar181._8_4_;
          auVar273._8_4_ = fVar147 * auVar259._8_4_;
          fVar148 = auVar181._12_4_;
          auVar273._12_4_ = fVar148 * auVar259._12_4_;
          auVar252._0_4_ = auVar112._0_4_ + auVar214._0_4_;
          auVar252._4_4_ = auVar112._4_4_ + auVar214._4_4_;
          auVar252._8_4_ = auVar112._8_4_ + auVar214._8_4_;
          auVar252._12_4_ = auVar112._12_4_ + auVar214._12_4_;
          auVar321._8_8_ = 0x3f800000;
          auVar321._0_8_ = 0x3f800000;
          auVar112 = vsubps_avx(auVar321,auVar252);
          auVar214 = vsubps_avx(auVar321,auVar338);
          auVar339._0_4_ = fVar150 * auVar280._0_4_;
          auVar339._4_4_ = fVar128 * auVar280._4_4_;
          auVar339._8_4_ = fVar147 * auVar280._8_4_;
          auVar339._12_4_ = fVar148 * auVar280._12_4_;
          fVar190 = auVar268._0_4_;
          auVar297._0_4_ = fVar190 * auVar259._0_4_;
          fVar191 = auVar268._4_4_;
          auVar297._4_4_ = fVar191 * auVar259._4_4_;
          fVar192 = auVar268._8_4_;
          auVar297._8_4_ = fVar192 * auVar259._8_4_;
          fVar290 = auVar268._12_4_;
          auVar297._12_4_ = fVar290 * auVar259._12_4_;
          auVar121._0_4_ = fVar190 * auVar280._0_4_;
          auVar121._4_4_ = fVar191 * auVar280._4_4_;
          auVar121._8_4_ = fVar192 * auVar280._8_4_;
          auVar121._12_4_ = fVar290 * auVar280._12_4_;
          auVar356._0_4_ = fVar150 * auVar112._0_4_;
          auVar356._4_4_ = fVar128 * auVar112._4_4_;
          auVar356._8_4_ = fVar147 * auVar112._8_4_;
          auVar356._12_4_ = fVar148 * auVar112._12_4_;
          auVar313._0_4_ = fVar150 * auVar214._0_4_;
          auVar313._4_4_ = fVar128 * auVar214._4_4_;
          auVar313._8_4_ = fVar147 * auVar214._8_4_;
          auVar313._12_4_ = fVar148 * auVar214._12_4_;
          auVar253._0_4_ = fVar190 * auVar112._0_4_;
          auVar253._4_4_ = fVar191 * auVar112._4_4_;
          auVar253._8_4_ = fVar192 * auVar112._8_4_;
          auVar253._12_4_ = fVar290 * auVar112._12_4_;
          auVar322._0_4_ = fVar190 * auVar214._0_4_;
          auVar322._4_4_ = fVar191 * auVar214._4_4_;
          auVar322._8_4_ = fVar192 * auVar214._8_4_;
          auVar322._12_4_ = fVar290 * auVar214._12_4_;
          auVar112 = vminps_avx(auVar356,auVar313);
          auVar214 = vminps_avx(auVar253,auVar322);
          auVar112 = vminps_avx(auVar112,auVar214);
          auVar214 = vmaxps_avx(auVar313,auVar356);
          auVar268 = vminps_avx(auVar273,auVar339);
          auVar258 = vminps_avx(auVar297,auVar121);
          auVar268 = vminps_avx(auVar268,auVar258);
          auVar112 = vhaddps_avx(auVar112,auVar268);
          auVar268 = vmaxps_avx(auVar322,auVar253);
          auVar214 = vmaxps_avx(auVar268,auVar214);
          auVar268 = vmaxps_avx(auVar339,auVar273);
          auVar258 = vmaxps_avx(auVar121,auVar297);
          auVar268 = vmaxps_avx(auVar258,auVar268);
          auVar214 = vhaddps_avx(auVar214,auVar268);
          auVar268 = vshufps_avx(auVar99,auVar99,0x54);
          auVar268 = vsubps_avx(auVar268,_local_740);
          auVar112 = vshufps_avx(auVar112,auVar112,0xe8);
          auVar214 = vshufps_avx(auVar214,auVar214,0xe8);
          auVar274._0_4_ = auVar268._0_4_ + auVar112._0_4_;
          auVar274._4_4_ = auVar268._4_4_ + auVar112._4_4_;
          auVar274._8_4_ = auVar268._8_4_ + auVar112._8_4_;
          auVar274._12_4_ = auVar268._12_4_ + auVar112._12_4_;
          auVar254._0_4_ = auVar268._0_4_ + auVar214._0_4_;
          auVar254._4_4_ = auVar268._4_4_ + auVar214._4_4_;
          auVar254._8_4_ = auVar268._8_4_ + auVar214._8_4_;
          auVar254._12_4_ = auVar268._12_4_ + auVar214._12_4_;
          auVar112 = vmaxps_avx(auVar139,auVar274);
          auVar214 = vminps_avx(auVar254,auVar215);
          auVar112 = vcmpps_avx(auVar214,auVar112,1);
          auVar112 = vshufps_avx(auVar112,auVar112,0x50);
          local_780 = vinsertps_avx(auVar343,ZEXT416((uint)auVar344._0_4_),0x10);
          if ((auVar112 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              auVar112[0xf] < '\0') goto LAB_01795e3f;
          bVar79 = 0;
          local_4f0 = auVar19._0_4_;
          fStack_4ec = auVar19._4_4_;
          fStack_4e8 = auVar19._8_4_;
          fStack_4e4 = auVar19._12_4_;
          if ((auVar233._0_4_ < auVar274._0_4_) && (bVar79 = 0, auVar254._0_4_ < auVar215._0_4_)) {
            auVar214 = vmovshdup_avx(auVar274);
            auVar112 = vcmpps_avx(auVar254,auVar215,1);
            bVar79 = auVar112[4] & auVar343._0_4_ < auVar214._0_4_;
          }
          if (((3 < (uint)uVar76 || fVar193 < 0.001) | bVar79) == 1) {
            lVar78 = 200;
            do {
              fVar147 = auVar268._0_4_;
              fVar128 = 1.0 - fVar147;
              fVar193 = fVar128 * fVar128 * fVar128;
              fVar150 = fVar147 * 3.0 * fVar128 * fVar128;
              fVar128 = fVar128 * fVar147 * fVar147 * 3.0;
              auVar206._4_4_ = fVar193;
              auVar206._0_4_ = fVar193;
              auVar206._8_4_ = fVar193;
              auVar206._12_4_ = fVar193;
              auVar142._4_4_ = fVar150;
              auVar142._0_4_ = fVar150;
              auVar142._8_4_ = fVar150;
              auVar142._12_4_ = fVar150;
              auVar122._4_4_ = fVar128;
              auVar122._0_4_ = fVar128;
              auVar122._8_4_ = fVar128;
              auVar122._12_4_ = fVar128;
              fVar147 = fVar147 * fVar147 * fVar147;
              auVar229._0_4_ = local_4f0 * fVar147;
              auVar229._4_4_ = fStack_4ec * fVar147;
              auVar229._8_4_ = fStack_4e8 * fVar147;
              auVar229._12_4_ = fStack_4e4 * fVar147;
              auVar112 = vfmadd231ps_fma(auVar229,auVar174,auVar122);
              auVar112 = vfmadd231ps_fma(auVar112,auVar18,auVar142);
              auVar112 = vfmadd231ps_fma(auVar112,auVar17,auVar206);
              auVar123._8_8_ = auVar112._0_8_;
              auVar123._0_8_ = auVar112._0_8_;
              auVar112 = vshufpd_avx(auVar112,auVar112,3);
              auVar214 = vshufps_avx(auVar268,auVar268,0x55);
              auVar112 = vsubps_avx(auVar112,auVar123);
              auVar214 = vfmadd213ps_fma(auVar112,auVar214,auVar123);
              fVar193 = auVar214._0_4_;
              auVar112 = vshufps_avx(auVar214,auVar214,0x55);
              auVar124._0_4_ = fVar151 * fVar193 + fVar211 * auVar112._0_4_;
              auVar124._4_4_ = auVar129._4_4_ * fVar193 + auVar130._4_4_ * auVar112._4_4_;
              auVar124._8_4_ = auVar129._8_4_ * fVar193 + auVar130._8_4_ * auVar112._8_4_;
              auVar124._12_4_ = auVar129._12_4_ * fVar193 + auVar130._12_4_ * auVar112._12_4_;
              auVar268 = vsubps_avx(auVar268,auVar124);
              auVar112 = vandps_avx(auVar345,auVar214);
              auVar214 = vshufps_avx(auVar112,auVar112,0xf5);
              auVar112 = vmaxss_avx(auVar214,auVar112);
              if (auVar112._0_4_ < (float)local_3b0._0_4_) {
                local_120 = auVar268._0_4_;
                if ((0.0 <= local_120) && (local_120 <= 1.0)) {
                  auVar112 = vmovshdup_avx(auVar268);
                  fVar193 = auVar112._0_4_;
                  if ((0.0 <= fVar193) && (fVar193 <= 1.0)) {
                    auVar129 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                             ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),
                                             0x1c);
                    auVar280 = vinsertps_avx(auVar129,ZEXT416((uint)pre->ray_space[k].vz.field_0.
                                                                    m128[2]),0x28);
                    auVar129 = vdpps_avx(auVar280,auVar20,0x7f);
                    auVar130 = vdpps_avx(auVar280,auVar21,0x7f);
                    auVar214 = vdpps_avx(auVar280,local_3c0,0x7f);
                    auVar139 = vdpps_avx(auVar280,local_3d0,0x7f);
                    auVar215 = vdpps_avx(auVar280,local_3e0,0x7f);
                    auVar258 = vdpps_avx(auVar280,local_3f0,0x7f);
                    auVar259 = vdpps_avx(auVar280,local_400,0x7f);
                    auVar280 = vdpps_avx(auVar280,local_410,0x7f);
                    fVar151 = 1.0 - fVar193;
                    auVar129 = vfmadd231ss_fma(ZEXT416((uint)(fVar193 * auVar215._0_4_)),
                                               ZEXT416((uint)fVar151),auVar129);
                    auVar130 = vfmadd231ss_fma(ZEXT416((uint)(auVar258._0_4_ * fVar193)),
                                               ZEXT416((uint)fVar151),auVar130);
                    auVar214 = vfmadd231ss_fma(ZEXT416((uint)(auVar259._0_4_ * fVar193)),
                                               ZEXT416((uint)fVar151),auVar214);
                    auVar139 = vfmadd231ss_fma(ZEXT416((uint)(fVar193 * auVar280._0_4_)),
                                               ZEXT416((uint)fVar151),auVar139);
                    fVar150 = 1.0 - local_120;
                    fVar193 = fVar150 * local_120 * local_120 * 3.0;
                    fVar147 = local_120 * local_120 * local_120;
                    auVar214 = vfmadd231ss_fma(ZEXT416((uint)(fVar147 * auVar139._0_4_)),
                                               ZEXT416((uint)fVar193),auVar214);
                    fVar151 = local_120 * 3.0 * fVar150 * fVar150;
                    auVar130 = vfmadd231ss_fma(auVar214,ZEXT416((uint)fVar151),auVar130);
                    fVar211 = fVar150 * fVar150 * fVar150;
                    auVar129 = vfmadd231ss_fma(auVar130,ZEXT416((uint)fVar211),auVar129);
                    fVar128 = auVar129._0_4_;
                    if ((fVar85 <= fVar128) &&
                       (fVar148 = *(float *)(ray + k * 4 + 0x100), fVar128 <= fVar148)) {
                      pGVar7 = (context->scene->geometries).items[uVar75].ptr;
                      if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                        bVar84 = false;
                      }
                      else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                              (bVar84 = true, pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0))
                      {
                        auVar129 = vshufps_avx(auVar268,auVar268,0x55);
                        auVar287._8_4_ = 0x3f800000;
                        auVar287._0_8_ = &DAT_3f8000003f800000;
                        auVar287._12_4_ = 0x3f800000;
                        auVar130 = vsubps_avx(auVar287,auVar129);
                        local_550 = auVar90._0_4_;
                        fStack_54c = auVar90._4_4_;
                        fStack_548 = auVar90._8_4_;
                        fStack_544 = auVar90._12_4_;
                        fVar190 = auVar129._0_4_;
                        auVar298._0_4_ = fVar190 * local_550;
                        fVar191 = auVar129._4_4_;
                        auVar298._4_4_ = fVar191 * fStack_54c;
                        fVar192 = auVar129._8_4_;
                        auVar298._8_4_ = fVar192 * fStack_548;
                        fVar290 = auVar129._12_4_;
                        auVar298._12_4_ = fVar290 * fStack_544;
                        local_5e0 = auVar87._0_4_;
                        fStack_5dc = auVar87._4_4_;
                        fStack_5d8 = auVar87._8_4_;
                        fStack_5d4 = auVar87._12_4_;
                        auVar314._0_4_ = fVar190 * local_5e0;
                        auVar314._4_4_ = fVar191 * fStack_5dc;
                        auVar314._8_4_ = fVar192 * fStack_5d8;
                        auVar314._12_4_ = fVar290 * fStack_5d4;
                        local_560 = auVar88._0_4_;
                        fStack_55c = auVar88._4_4_;
                        fStack_558 = auVar88._8_4_;
                        fStack_554 = auVar88._12_4_;
                        auVar323._0_4_ = fVar190 * local_560;
                        auVar323._4_4_ = fVar191 * fStack_55c;
                        auVar323._8_4_ = fVar192 * fStack_558;
                        auVar323._12_4_ = fVar290 * fStack_554;
                        local_5f0 = auVar104._0_4_;
                        fStack_5ec = auVar104._4_4_;
                        fStack_5e8 = auVar104._8_4_;
                        fStack_5e4 = auVar104._12_4_;
                        auVar275._0_4_ = fVar190 * local_5f0;
                        auVar275._4_4_ = fVar191 * fStack_5ec;
                        auVar275._8_4_ = fVar192 * fStack_5e8;
                        auVar275._12_4_ = fVar290 * fStack_5e4;
                        auVar129 = vfmadd231ps_fma(auVar298,auVar130,auVar22);
                        auVar214 = vfmadd231ps_fma(auVar314,auVar130,auVar328);
                        auVar139 = vfmadd231ps_fma(auVar323,auVar130,auVar30);
                        auVar215 = vfmadd231ps_fma(auVar275,auVar130,auVar89);
                        auVar129 = vsubps_avx(auVar214,auVar129);
                        auVar130 = vsubps_avx(auVar139,auVar214);
                        auVar214 = vsubps_avx(auVar215,auVar139);
                        auVar324._0_4_ = local_120 * auVar130._0_4_;
                        auVar324._4_4_ = local_120 * auVar130._4_4_;
                        auVar324._8_4_ = local_120 * auVar130._8_4_;
                        auVar324._12_4_ = local_120 * auVar130._12_4_;
                        auVar255._4_4_ = fVar150;
                        auVar255._0_4_ = fVar150;
                        auVar255._8_4_ = fVar150;
                        auVar255._12_4_ = fVar150;
                        auVar129 = vfmadd231ps_fma(auVar324,auVar255,auVar129);
                        auVar276._0_4_ = local_120 * auVar214._0_4_;
                        auVar276._4_4_ = local_120 * auVar214._4_4_;
                        auVar276._8_4_ = local_120 * auVar214._8_4_;
                        auVar276._12_4_ = local_120 * auVar214._12_4_;
                        auVar130 = vfmadd231ps_fma(auVar276,auVar255,auVar130);
                        auVar277._0_4_ = local_120 * auVar130._0_4_;
                        auVar277._4_4_ = local_120 * auVar130._4_4_;
                        auVar277._8_4_ = local_120 * auVar130._8_4_;
                        auVar277._12_4_ = local_120 * auVar130._12_4_;
                        auVar130 = vfmadd231ps_fma(auVar277,auVar255,auVar129);
                        auVar230._0_4_ = fVar147 * (float)local_470._0_4_;
                        auVar230._4_4_ = fVar147 * (float)local_470._4_4_;
                        auVar230._8_4_ = fVar147 * fStack_468;
                        auVar230._12_4_ = fVar147 * fStack_464;
                        auVar164._4_4_ = fVar193;
                        auVar164._0_4_ = fVar193;
                        auVar164._8_4_ = fVar193;
                        auVar164._12_4_ = fVar193;
                        auVar129 = vfmadd132ps_fma(auVar164,auVar230,local_460);
                        auVar207._4_4_ = fVar151;
                        auVar207._0_4_ = fVar151;
                        auVar207._8_4_ = fVar151;
                        auVar207._12_4_ = fVar151;
                        auVar129 = vfmadd132ps_fma(auVar207,auVar129,local_450);
                        auVar165._0_4_ = auVar130._0_4_ * 3.0;
                        auVar165._4_4_ = auVar130._4_4_ * 3.0;
                        auVar165._8_4_ = auVar130._8_4_ * 3.0;
                        auVar165._12_4_ = auVar130._12_4_ * 3.0;
                        auVar187._4_4_ = fVar211;
                        auVar187._0_4_ = fVar211;
                        auVar187._8_4_ = fVar211;
                        auVar187._12_4_ = fVar211;
                        auVar130 = vfmadd132ps_fma(auVar187,auVar129,local_440);
                        auVar129 = vshufps_avx(auVar165,auVar165,0xc9);
                        auVar208._0_4_ = auVar130._0_4_ * auVar129._0_4_;
                        auVar208._4_4_ = auVar130._4_4_ * auVar129._4_4_;
                        auVar208._8_4_ = auVar130._8_4_ * auVar129._8_4_;
                        auVar208._12_4_ = auVar130._12_4_ * auVar129._12_4_;
                        auVar129 = vshufps_avx(auVar130,auVar130,0xc9);
                        auVar130 = vfmsub231ps_fma(auVar208,auVar165,auVar129);
                        auVar129 = vmovshdup_avx(auVar130);
                        local_180 = auVar129._0_8_;
                        uStack_178 = local_180;
                        uStack_170 = local_180;
                        uStack_168 = local_180;
                        auVar129 = vshufps_avx(auVar130,auVar130,0xaa);
                        local_160 = auVar129._0_8_;
                        uStack_158 = local_160;
                        uStack_150 = local_160;
                        uStack_148 = local_160;
                        local_140 = auVar130._0_4_;
                        uStack_13c = local_140;
                        uStack_138 = local_140;
                        uStack_134 = local_140;
                        uStack_130 = local_140;
                        uStack_12c = local_140;
                        uStack_128 = local_140;
                        uStack_124 = local_140;
                        fStack_11c = local_120;
                        fStack_118 = local_120;
                        fStack_114 = local_120;
                        fStack_110 = local_120;
                        fStack_10c = local_120;
                        fStack_108 = local_120;
                        fStack_104 = local_120;
                        local_100 = auVar112._0_8_;
                        uStack_f8 = local_100;
                        uStack_f0 = local_100;
                        uStack_e8 = local_100;
                        local_e0 = CONCAT44(uStack_33c,local_340);
                        uStack_d8 = CONCAT44(uStack_334,uStack_338);
                        uStack_d0 = CONCAT44(uStack_32c,uStack_330);
                        uStack_c8 = CONCAT44(uStack_324,uStack_328);
                        local_c0 = CONCAT44(uStack_31c,local_320);
                        uStack_b8 = CONCAT44(uStack_314,uStack_318);
                        uStack_b0 = CONCAT44(uStack_30c,uStack_310);
                        uStack_a8 = CONCAT44(uStack_304,uStack_308);
                        auVar101 = vpcmpeqd_avx2(ZEXT1632(auVar112),ZEXT1632(auVar112));
                        uStack_9c = context->user->instID[0];
                        local_a0 = uStack_9c;
                        uStack_98 = uStack_9c;
                        uStack_94 = uStack_9c;
                        uStack_90 = uStack_9c;
                        uStack_8c = uStack_9c;
                        uStack_88 = uStack_9c;
                        uStack_84 = uStack_9c;
                        uStack_7c = context->user->instPrimID[0];
                        local_80 = uStack_7c;
                        uStack_78 = uStack_7c;
                        uStack_74 = uStack_7c;
                        uStack_70 = uStack_7c;
                        uStack_6c = uStack_7c;
                        uStack_68 = uStack_7c;
                        uStack_64 = uStack_7c;
                        *(float *)(ray + k * 4 + 0x100) = fVar128;
                        local_4a0 = local_360._0_8_;
                        uStack_498 = local_360._8_8_;
                        uStack_490 = local_360._16_8_;
                        uStack_488 = local_360._24_8_;
                        local_4d0.valid = (int *)&local_4a0;
                        local_4d0.geometryUserPtr = pGVar7->userPtr;
                        local_4d0.context = context->user;
                        local_4d0.ray = (RTCRayN *)ray;
                        local_4d0.hit = (RTCHitN *)&local_180;
                        local_4d0.N = 8;
                        if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar7->occlusionFilterN)(&local_4d0);
                          auVar127._8_56_ = extraout_var;
                          auVar127._0_8_ = extraout_XMM1_Qa;
                          auVar101 = vpcmpeqd_avx2(auVar127._0_32_,auVar127._0_32_);
                        }
                        auVar64._8_8_ = uStack_498;
                        auVar64._0_8_ = local_4a0;
                        auVar64._16_8_ = uStack_490;
                        auVar64._24_8_ = uStack_488;
                        auVar102 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar64)
                        ;
                        auVar103 = auVar101 & ~auVar102;
                        if ((((((((auVar103 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar103 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar103 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar103 >> 0x7f,0) == '\0')
                              && (auVar103 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar103 >> 0xbf,0) == '\0') &&
                            (auVar103 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar103[0x1f]) {
                          auVar102 = auVar102 ^ auVar101;
                        }
                        else {
                          p_Var13 = context->args->filter;
                          if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var13)(&local_4d0);
                          }
                          auVar65._8_8_ = uStack_498;
                          auVar65._0_8_ = local_4a0;
                          auVar65._16_8_ = uStack_490;
                          auVar65._24_8_ = uStack_488;
                          auVar103 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                          auVar101 = vpcmpeqd_avx2(auVar103,auVar65);
                          auVar102 = vpcmpeqd_avx2(auVar103,auVar103);
                          auVar102 = auVar101 ^ auVar102;
                          auVar146._8_4_ = 0xff800000;
                          auVar146._0_8_ = 0xff800000ff800000;
                          auVar146._12_4_ = 0xff800000;
                          auVar146._16_4_ = 0xff800000;
                          auVar146._20_4_ = 0xff800000;
                          auVar146._24_4_ = 0xff800000;
                          auVar146._28_4_ = 0xff800000;
                          auVar101 = vblendvps_avx(auVar146,*(undefined1 (*) [32])
                                                             (local_4d0.ray + 0x100),auVar101);
                          *(undefined1 (*) [32])(local_4d0.ray + 0x100) = auVar101;
                        }
                        bVar60 = (auVar102 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                        ;
                        bVar61 = (auVar102 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                        ;
                        bVar59 = (auVar102 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                        ;
                        bVar58 = SUB321(auVar102 >> 0x7f,0) != '\0';
                        bVar57 = (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                        ;
                        bVar56 = SUB321(auVar102 >> 0xbf,0) != '\0';
                        bVar54 = (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                        ;
                        bVar84 = auVar102[0x1f] < '\0';
                        if (((((((!bVar60 && !bVar61) && !bVar59) && !bVar58) && !bVar57) && !bVar56
                             ) && !bVar54) && !bVar84) {
                          *(float *)(ray + k * 4 + 0x100) = fVar148;
                        }
                        bVar84 = ((((((bVar60 || bVar61) || bVar59) || bVar58) || bVar57) || bVar56)
                                 || bVar54) || bVar84;
                      }
                      bVar83 = (bool)(bVar83 | bVar84);
                    }
                  }
                }
                break;
              }
              lVar78 = lVar78 + -1;
            } while (lVar78 != 0);
          }
          else {
            bVar53 = false;
          }
        }
      }
    } while (bVar53);
    local_420 = vinsertps_avx(auVar106,ZEXT416((uint)fVar210),0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }